

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O0

void av1_dist_wtd_convolve_2d_copy_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i offset_const_00;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  uint uVar101;
  int32_t iVar102;
  uint uVar103;
  int in_ECX;
  undefined8 *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  uint in_ESI;
  __m256i *palVar104;
  longlong *plVar105;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  int in_R9D;
  longlong lVar106;
  longlong lVar107;
  longlong lVar108;
  longlong lVar109;
  longlong lVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  longlong lVar119;
  longlong lVar120;
  longlong lVar121;
  longlong lVar122;
  longlong lVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  longlong lVar128;
  longlong lVar129;
  longlong lVar130;
  longlong lVar131;
  longlong lVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  longlong lVar137;
  longlong lVar138;
  longlong lVar139;
  longlong lVar140;
  longlong lVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  undefined8 uVar144;
  undefined8 uVar145;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  __m128i s;
  __m128i s_00;
  __m128i s_01;
  __m128i s_02;
  int *in_stack_00000008;
  __m128i res_32_5;
  __m128i res_10_5;
  __m256i res_3210_1;
  __m256i ref_3210_1;
  __m256i src_3210_1;
  __m256i src_3210_8bit_1;
  __m128i res_31_1;
  __m128i res_20_1;
  __m256i res_4;
  __m256i res_32_4;
  __m256i res_10_4;
  __m256i ref_32_1;
  __m256i ref_10_1;
  __m256i src_32_1;
  __m256i src_10_1;
  __m128i src_3_3;
  __m128i src_2_3;
  __m128i src_1_3;
  __m128i src_0_3;
  __m256i res_32_3;
  __m256i res_10_3;
  __m256i res_3_1;
  __m256i res_2_1;
  __m256i res_1_1;
  __m256i res_0_1;
  __m256i ref_3_1;
  __m256i ref_2_1;
  __m256i ref_1_1;
  __m256i ref_0_1;
  __m256i src_3_2;
  __m256i src_2_2;
  __m256i src_1_2;
  __m256i src_0_2;
  int i_1;
  __m128i res_32_2;
  __m128i res_10_2;
  __m256i res_3210;
  __m256i ref_3210;
  __m256i src_3210;
  __m256i src_3210_8bit;
  __m128i res_31;
  __m128i res_20;
  __m256i res;
  __m256i res_32_1;
  __m256i res_10_1;
  __m256i ref_32;
  __m256i ref_10;
  __m256i src_32;
  __m256i src_10;
  __m128i src_3_1;
  __m128i src_2_1;
  __m128i src_1_1;
  __m128i src_0_1;
  __m256i res_32;
  __m256i res_10;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  __m256i ref_3;
  __m256i ref_2;
  __m256i ref_1;
  __m256i ref_0;
  __m256i src_3;
  __m256i src_2;
  __m256i src_1;
  __m256i src_0;
  int i;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const;
  int offset;
  int offset_0;
  __m256i zero;
  __m256i wt;
  int use_dist_wtd_comp_avg;
  int do_average;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  int bd;
  undefined8 in_stack_ffffffffffffc5b8;
  int iVar152;
  __m256i *in_stack_ffffffffffffc5c0;
  undefined4 in_stack_ffffffffffffc5c8;
  undefined4 in_stack_ffffffffffffc5cc;
  undefined4 uVar153;
  __m256i *in_stack_ffffffffffffc5d0;
  __m256i *res_unsigned;
  undefined4 in_stack_ffffffffffffc5e8;
  undefined4 in_stack_ffffffffffffc5ec;
  int in_stack_ffffffffffffc67c;
  int iVar154;
  __m256i *in_stack_ffffffffffffc680;
  __m256i *in_stack_ffffffffffffc688;
  __m256i *in_stack_ffffffffffffc690;
  undefined4 in_stack_ffffffffffffc6b8;
  undefined4 in_stack_ffffffffffffc6bc;
  undefined8 in_stack_ffffffffffffc6c0;
  undefined8 in_stack_ffffffffffffc6c8;
  longlong in_stack_ffffffffffffc6d0;
  undefined8 in_stack_ffffffffffffc6f0;
  int in_stack_ffffffffffffc6f8;
  int in_stack_ffffffffffffc6fc;
  CONV_BUF_TYPE *in_stack_ffffffffffffc700;
  undefined8 in_stack_ffffffffffffc708;
  uint8_t *in_stack_ffffffffffffc710;
  undefined4 local_38c0;
  undefined4 uStack_38bc;
  undefined4 uStack_38ac;
  undefined1 local_38a0 [16];
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3820;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 *puStack_36a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  int local_3504;
  undefined4 local_3500;
  undefined4 uStack_34fc;
  undefined4 uStack_34ec;
  undefined1 local_34e0 [16];
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3460;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 *puStack_32e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  int local_3144;
  undefined1 local_3140 [16];
  undefined1 auStack_3130 [16];
  int local_3104;
  longlong local_3100;
  longlong lStack_30f8;
  longlong lStack_30f0;
  longlong lStack_30e8;
  uint local_30c8;
  int local_30c4;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  longlong local_30a0 [7];
  int local_3064;
  int local_3060;
  uint local_305c;
  __m256i *local_3058;
  undefined4 local_3050;
  int local_304c;
  int local_3048;
  int local_3044;
  undefined8 *local_3040;
  uint local_3034;
  undefined1 (*local_3030) [16];
  ushort local_3024;
  ushort local_3022;
  longlong local_3020;
  longlong lStack_3018;
  longlong lStack_3010;
  longlong lStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  longlong local_2fe0;
  longlong lStack_2fd8;
  longlong lStack_2fd0;
  longlong lStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  longlong local_2fa0;
  longlong lStack_2f98;
  longlong lStack_2f90;
  longlong lStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  longlong local_2f60;
  longlong lStack_2f58;
  longlong lStack_2f50;
  longlong lStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  longlong local_2f20;
  longlong lStack_2f18;
  longlong lStack_2f10;
  longlong lStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  longlong local_2ee0;
  longlong lStack_2ed8;
  longlong lStack_2ed0;
  longlong lStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  longlong local_2ea0;
  longlong lStack_2e98;
  longlong lStack_2e90;
  longlong lStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  longlong local_2e60;
  longlong lStack_2e58;
  longlong lStack_2e50;
  longlong lStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  longlong local_2e20;
  longlong lStack_2e18;
  longlong lStack_2e10;
  longlong lStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  longlong local_2de0;
  longlong lStack_2dd8;
  longlong lStack_2dd0;
  longlong lStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  longlong local_2da0;
  longlong lStack_2d98;
  longlong lStack_2d90;
  longlong lStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  longlong local_2d60;
  longlong lStack_2d58;
  longlong lStack_2d50;
  longlong lStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  longlong local_2d20;
  longlong lStack_2d18;
  longlong lStack_2d10;
  longlong lStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  longlong local_2ce0;
  longlong lStack_2cd8;
  longlong lStack_2cd0;
  longlong lStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  longlong local_2ca0;
  longlong lStack_2c98;
  longlong lStack_2c90;
  longlong lStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  longlong local_2c60;
  longlong lStack_2c58;
  longlong lStack_2c50;
  longlong lStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  longlong local_2c20;
  longlong lStack_2c18;
  longlong lStack_2c10;
  longlong lStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  longlong local_2be0;
  longlong lStack_2bd8;
  longlong lStack_2bd0;
  longlong lStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  longlong local_2ba0;
  longlong lStack_2b98;
  longlong lStack_2b90;
  longlong lStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  longlong local_2b60;
  longlong lStack_2b58;
  longlong lStack_2b50;
  longlong lStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  longlong local_2b20;
  longlong lStack_2b18;
  longlong lStack_2b10;
  longlong lStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  longlong local_2ae0;
  longlong lStack_2ad8;
  longlong lStack_2ad0;
  longlong lStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  longlong local_2aa0;
  longlong lStack_2a98;
  longlong lStack_2a90;
  longlong lStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  longlong local_2a60;
  longlong lStack_2a58;
  longlong lStack_2a50;
  longlong lStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  longlong local_2a20;
  longlong lStack_2a18;
  longlong lStack_2a10;
  longlong lStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  longlong local_29e0;
  longlong lStack_29d8;
  longlong lStack_29d0;
  longlong lStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  longlong local_29a0;
  longlong lStack_2998;
  longlong lStack_2990;
  longlong lStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  longlong local_2960;
  longlong lStack_2958;
  longlong lStack_2950;
  longlong lStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  longlong local_2920;
  longlong lStack_2918;
  longlong lStack_2910;
  longlong lStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  longlong local_28e0;
  longlong lStack_28d8;
  longlong lStack_28d0;
  longlong lStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  longlong local_28a0;
  longlong lStack_2898;
  longlong lStack_2890;
  longlong lStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  longlong local_2860;
  longlong lStack_2858;
  longlong lStack_2850;
  longlong lStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  longlong local_2820;
  longlong lStack_2818;
  longlong lStack_2810;
  longlong lStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  longlong local_27e0;
  longlong lStack_27d8;
  longlong lStack_27d0;
  longlong lStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  longlong local_27a0;
  longlong lStack_2798;
  longlong lStack_2790;
  longlong lStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  longlong local_2760;
  longlong lStack_2758;
  longlong lStack_2750;
  longlong lStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  longlong local_2720;
  longlong lStack_2718;
  longlong lStack_2710;
  longlong lStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  longlong local_26e0;
  longlong lStack_26d8;
  longlong lStack_26d0;
  longlong lStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  longlong local_26a0;
  longlong lStack_2698;
  longlong lStack_2690;
  longlong lStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  longlong local_2660;
  longlong lStack_2658;
  longlong lStack_2650;
  longlong lStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  longlong local_2620;
  longlong lStack_2618;
  longlong lStack_2610;
  longlong lStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  longlong local_25e0;
  longlong lStack_25d8;
  longlong lStack_25d0;
  longlong lStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  longlong local_25a0;
  longlong lStack_2598;
  longlong lStack_2590;
  longlong lStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  longlong local_2560;
  longlong lStack_2558;
  longlong lStack_2550;
  longlong lStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  longlong local_2520;
  longlong lStack_2518;
  longlong lStack_2510;
  longlong lStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  longlong local_24e0;
  longlong lStack_24d8;
  longlong lStack_24d0;
  longlong lStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined4 local_2484;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined4 local_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined4 local_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined4 local_23c4;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined4 local_2384;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined4 local_2344;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined4 local_2304;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined4 local_22c4;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined4 local_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined4 local_2244;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined4 local_2204;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined4 local_21c4;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined4 local_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined4 local_2144;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined4 local_2104;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined4 local_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined4 local_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined4 local_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined4 local_2004;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined4 local_1fc4;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined4 local_1f84;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined4 local_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined4 local_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined4 local_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined4 local_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined4 local_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined4 local_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined4 local_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined4 local_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined4 local_1d44;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined4 local_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined4 local_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined4 local_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined4 local_1c44;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined4 local_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined4 local_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined4 local_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined4 local_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined4 local_1b04;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined4 local_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined4 local_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined4 local_1a44;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined4 local_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined4 local_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined4 local_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined4 local_1944;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  longlong local_17a0;
  longlong lStack_1798;
  longlong lStack_1790;
  longlong lStack_1788;
  longlong local_1780;
  longlong lStack_1778;
  longlong lStack_1770;
  longlong lStack_1768;
  longlong local_1760;
  longlong lStack_1758;
  longlong lStack_1750;
  longlong lStack_1748;
  longlong local_1740;
  longlong lStack_1738;
  longlong lStack_1730;
  longlong lStack_1728;
  longlong local_1720;
  longlong lStack_1718;
  longlong lStack_1710;
  longlong lStack_1708;
  longlong local_1700;
  longlong lStack_16f8;
  longlong lStack_16f0;
  longlong lStack_16e8;
  longlong local_16e0;
  longlong lStack_16d8;
  longlong lStack_16d0;
  longlong lStack_16c8;
  longlong local_16c0;
  longlong lStack_16b8;
  longlong lStack_16b0;
  longlong lStack_16a8;
  longlong local_16a0;
  longlong lStack_1698;
  longlong lStack_1690;
  longlong lStack_1688;
  longlong local_1680;
  longlong lStack_1678;
  longlong lStack_1670;
  longlong lStack_1668;
  longlong local_1660;
  longlong lStack_1658;
  longlong lStack_1650;
  longlong lStack_1648;
  longlong local_1640;
  longlong lStack_1638;
  longlong lStack_1630;
  longlong lStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  longlong local_14a0;
  longlong lStack_1498;
  longlong lStack_1490;
  longlong lStack_1488;
  longlong local_1480;
  longlong lStack_1478;
  longlong lStack_1470;
  longlong lStack_1468;
  longlong local_1460;
  longlong lStack_1458;
  longlong lStack_1450;
  longlong lStack_1448;
  longlong local_1440;
  longlong lStack_1438;
  longlong lStack_1430;
  longlong lStack_1428;
  longlong local_1420;
  longlong lStack_1418;
  longlong lStack_1410;
  longlong lStack_1408;
  longlong local_1400;
  longlong lStack_13f8;
  longlong lStack_13f0;
  longlong lStack_13e8;
  longlong local_13e0;
  longlong lStack_13d8;
  longlong lStack_13d0;
  longlong lStack_13c8;
  longlong local_13c0;
  longlong lStack_13b8;
  longlong lStack_13b0;
  longlong lStack_13a8;
  longlong local_13a0;
  longlong lStack_1398;
  longlong lStack_1390;
  longlong lStack_1388;
  longlong local_1380;
  longlong lStack_1378;
  longlong lStack_1370;
  longlong lStack_1368;
  longlong local_1360;
  longlong lStack_1358;
  longlong lStack_1350;
  longlong lStack_1348;
  longlong local_1340;
  longlong lStack_1338;
  longlong lStack_1330;
  longlong lStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 *puStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 *puStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 *puStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 *puStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 *puStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 *puStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 *puStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 *puStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 *puStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 *puStack_1028;
  undefined8 *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 *local_fe8;
  undefined8 *local_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 *local_fa8;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 *local_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 *local_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 *local_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 *local_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 *local_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 *local_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 *local_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 *local_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 *local_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 *local_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 *local_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 *local_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 *local_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 *local_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 *local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 *local_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 *local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 *local_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 *local_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 *local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 *local_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 *local_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 *local_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 *local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 *local_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 *local_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 *local_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 *local_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 *local_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 *local_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 *local_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 *local_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 *local_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 *local_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 *local_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 *local_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 *local_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  ulong local_a00;
  undefined8 uStack_9f8;
  ulong local_9f0;
  undefined8 uStack_9e8;
  ulong local_9e0;
  undefined8 uStack_9d8;
  ulong local_9d0;
  undefined8 uStack_9c8;
  undefined1 (*local_9c0) [16];
  undefined1 (*local_9b8) [16];
  undefined1 (*local_9b0) [16];
  undefined1 (*local_9a8) [16];
  undefined1 (*local_9a0) [16];
  undefined1 (*local_998) [16];
  undefined1 (*local_990) [16];
  undefined1 (*local_988) [16];
  undefined1 (*local_980) [16];
  undefined1 (*local_978) [16];
  undefined1 (*local_970) [16];
  undefined1 (*local_968) [16];
  undefined1 (*local_960) [16];
  undefined1 (*local_958) [16];
  undefined1 (*local_950) [16];
  undefined1 (*local_948) [16];
  undefined1 (*local_940) [16];
  undefined1 (*local_938) [16];
  undefined1 (*local_930) [16];
  undefined1 (*local_928) [16];
  undefined1 (*local_920) [16];
  undefined1 (*local_918) [16];
  undefined1 (*local_910) [16];
  undefined1 (*local_908) [16];
  undefined1 (*local_900) [16];
  undefined1 (*local_8f8) [16];
  undefined1 (*local_8f0) [16];
  undefined1 (*local_8e8) [16];
  undefined1 (*local_8e0) [16];
  undefined1 (*local_8d8) [16];
  undefined1 (*local_8d0) [16];
  undefined1 (*local_8c8) [16];
  undefined1 (*local_8c0) [16];
  undefined1 (*local_8b8) [16];
  undefined1 (*local_8b0) [16];
  undefined1 (*local_8a8) [16];
  undefined1 (*local_8a0) [16];
  undefined1 (*local_898) [16];
  undefined1 (*local_890) [16];
  undefined1 (*local_888) [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  ulong local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  ulong local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  ulong local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  ulong local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 *local_700;
  long local_6f8;
  long local_6f0;
  __m256i *local_6e8;
  undefined8 *local_6e0;
  __m256i *local_6d8;
  long local_6d0;
  __m256i *local_6c8;
  __m256i *local_6c0;
  __m256i *local_6b8;
  __m256i *local_6b0;
  __m256i *local_6a8;
  __m256i *local_6a0;
  __m256i *local_698;
  __m256i *local_690;
  __m256i *local_688;
  __m256i *local_680;
  __m256i *local_678;
  __m256i *local_670;
  __m256i *local_668;
  undefined8 *local_660;
  long local_658;
  long local_650;
  __m256i *local_648;
  undefined8 *local_640;
  __m256i *local_638;
  long local_630;
  __m256i *local_628;
  __m256i *local_620;
  __m256i *local_618;
  __m256i *local_610;
  __m256i *local_608;
  __m256i *local_600;
  __m256i *local_5f8;
  __m256i *local_5f0;
  __m256i *local_5e8;
  __m256i *local_5e0;
  __m256i *local_5d8;
  __m256i *local_5d0;
  __m256i *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 *local_328;
  ulong local_320;
  undefined8 uStack_318;
  ulong *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 *local_2e8;
  ulong local_2e0;
  undefined8 uStack_2d8;
  undefined1 (*local_2c8) [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 *local_2a8;
  ulong local_2a0;
  undefined8 uStack_298;
  ulong *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 *local_268;
  ulong local_260;
  undefined8 uStack_258;
  undefined1 (*local_248) [16];
  undefined4 local_240;
  undefined4 local_23c;
  int32_t local_238;
  uint local_234;
  undefined4 local_230;
  undefined4 local_22c;
  int32_t local_228;
  uint local_224;
  undefined4 local_220;
  undefined4 local_21c;
  int32_t local_218;
  uint local_214;
  undefined4 local_210;
  undefined4 local_20c;
  int32_t local_208;
  uint local_204;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  ushort local_1a0;
  ushort local_19e;
  ushort local_19c;
  ushort local_19a;
  ushort local_198;
  ushort local_196;
  ushort local_194;
  ushort local_192;
  ushort local_190;
  ushort local_18e;
  ushort local_18c;
  ushort local_18a;
  ushort local_188;
  ushort local_186;
  ushort local_184;
  ushort local_182;
  undefined1 local_180 [32];
  ushort local_160;
  ushort local_15e;
  ushort local_15c;
  ushort local_15a;
  ushort local_158;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  ushort local_150;
  ushort local_14e;
  ushort local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  uint local_120;
  int32_t local_11c;
  undefined4 local_118;
  undefined4 local_114;
  uint local_110;
  int32_t local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  int32_t local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  uint local_d0;
  int32_t local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iVar154 = (int)((ulong)in_stack_ffffffffffffc708 >> 0x20);
  iVar152 = (int)((ulong)in_stack_ffffffffffffc6f0 >> 0x20);
  local_3050 = 8;
  local_3058 = *(__m256i **)(in_stack_00000008 + 2);
  local_305c = in_stack_00000008[4];
  local_3060 = *in_stack_00000008;
  local_3064 = in_stack_00000008[9];
  local_304c = in_R9D;
  local_3048 = in_R8D;
  local_3044 = in_ECX;
  local_3040 = in_RDX;
  local_3034 = in_ESI;
  local_3030 = in_RDI;
  unpack_weights_avx2((ConvolveParams *)
                      CONCAT44(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8));
  local_a20 = 0;
  uStack_a18 = 0;
  uStack_a10 = 0;
  uStack_a08 = 0;
  local_30c0 = 0;
  uStack_30b8 = 0;
  uStack_30b0 = 0;
  uStack_30a8 = 0;
  local_30c4 = 0x16 - (in_stack_00000008[5] + in_stack_00000008[6]);
  local_30c8 = (1 << ((byte)local_30c4 & 0x1f)) + (1 << ((byte)local_30c4 - 1 & 0x1f));
  local_3022 = (ushort)local_30c8;
  local_182 = (ushort)local_30c8;
  local_184 = (ushort)local_30c8;
  local_186 = (ushort)local_30c8;
  local_188 = (ushort)local_30c8;
  local_18a = (ushort)local_30c8;
  local_18c = (ushort)local_30c8;
  local_18e = (ushort)local_30c8;
  local_190 = (ushort)local_30c8;
  local_192 = (ushort)local_30c8;
  local_194 = (ushort)local_30c8;
  local_196 = (ushort)local_30c8;
  local_198 = (ushort)local_30c8;
  local_19a = (ushort)local_30c8;
  local_19c = (ushort)local_30c8;
  local_19e = (ushort)local_30c8;
  local_1a0 = (ushort)local_30c8;
  auVar116 = vpinsrw_avx(ZEXT216((ushort)local_30c8),local_30c8 & 0xffff,1);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,2);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,3);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,4);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,5);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,6);
  local_1c0 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,7);
  auVar116 = vpinsrw_avx(ZEXT216((ushort)local_30c8),local_30c8 & 0xffff,1);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,2);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,3);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,4);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,5);
  auVar116 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,6);
  auStack_1b0 = vpinsrw_avx(auVar116,local_30c8 & 0xffff,7);
  local_3100 = local_1c0._0_8_;
  lStack_30f8 = local_1c0._8_8_;
  lStack_30f0 = auStack_1b0._0_8_;
  lStack_30e8 = auStack_1b0._8_8_;
  local_3104 = 0xe - (in_stack_00000008[5] + in_stack_00000008[6]);
  uVar101 = (uint)(1 << ((byte)local_3104 & 0x1f)) >> 1;
  local_3024 = (ushort)uVar101;
  auVar116 = vpinsrw_avx(ZEXT216(local_3024),uVar101 & 0xffff,1);
  auVar116 = vpinsrw_avx(auVar116,uVar101 & 0xffff,2);
  auVar116 = vpinsrw_avx(auVar116,uVar101 & 0xffff,3);
  auVar116 = vpinsrw_avx(auVar116,uVar101 & 0xffff,4);
  auVar116 = vpinsrw_avx(auVar116,uVar101 & 0xffff,5);
  auVar116 = vpinsrw_avx(auVar116,uVar101 & 0xffff,6);
  auVar116 = vpinsrw_avx(auVar116,uVar101 & 0xffff,7);
  auVar148 = vpinsrw_avx(ZEXT216(local_3024),uVar101 & 0xffff,1);
  auVar148 = vpinsrw_avx(auVar148,uVar101 & 0xffff,2);
  auVar148 = vpinsrw_avx(auVar148,uVar101 & 0xffff,3);
  auVar148 = vpinsrw_avx(auVar148,uVar101 & 0xffff,4);
  auVar148 = vpinsrw_avx(auVar148,uVar101 & 0xffff,5);
  auVar148 = vpinsrw_avx(auVar148,uVar101 & 0xffff,6);
  auVar148 = vpinsrw_avx(auVar148,uVar101 & 0xffff,7);
  local_180._0_16_ = ZEXT116(0) * auVar116 + ZEXT116(1) * auVar148;
  local_180._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar116;
  local_160 = local_3024;
  local_15e = local_3024;
  local_15c = local_3024;
  local_15a = local_3024;
  local_158 = local_3024;
  local_156 = local_3024;
  local_154 = local_3024;
  local_152 = local_3024;
  local_150 = local_3024;
  local_14e = local_3024;
  local_14c = local_3024;
  local_14a = local_3024;
  local_148 = local_3024;
  local_146 = local_3024;
  local_144 = local_3024;
  local_142 = local_3024;
  local_3140 = local_180._0_16_;
  auStack_3130 = local_180._16_16_;
  if (local_3060 == 0) {
    offset_const_00[0]._4_4_ = in_stack_ffffffffffffc6bc;
    offset_const_00[0]._0_4_ = in_stack_ffffffffffffc6b8;
    offset_const_00[1] = in_stack_ffffffffffffc6c0;
    offset_const_00[2] = in_stack_ffffffffffffc6c8;
    offset_const_00[3] = in_stack_ffffffffffffc6d0;
    av1_dist_wtd_convolve_2d_no_avg_copy_avx2
              (in_stack_ffffffffffffc710,iVar154,in_stack_ffffffffffffc700,in_stack_ffffffffffffc6fc
               ,in_stack_ffffffffffffc6f8,iVar152,offset_const_00);
  }
  else {
    iVar152 = (int)((ulong)in_stack_ffffffffffffc5b8 >> 0x20);
    if (local_3064 == 0) {
      local_3504 = local_304c;
      if (local_3048 < 0x10) {
        if (local_3048 == 8) {
          do {
            local_2c8 = local_3030;
            local_9f0 = *(ulong *)*local_3030;
            uStack_2d8 = 0;
            local_2e8 = (undefined8 *)(*local_3030 + (int)local_3034);
            uStack_7d0 = *local_2e8;
            uStack_2f8 = 0;
            local_308 = (ulong *)(*local_3030 + (int)(local_3034 * 2));
            local_a00 = *local_308;
            uStack_318 = 0;
            local_328 = (undefined8 *)(*local_3030 + (int)(local_3034 * 3));
            uStack_810 = *local_328;
            uStack_338 = 0;
            uStack_9e8 = 0;
            uStack_9f8 = 0;
            uStack_7d8 = 0;
            uStack_7c8 = 0;
            local_800 = local_30c0;
            uStack_7f8 = uStack_30b8;
            uStack_7f0 = uStack_30b0;
            uStack_7e8 = uStack_30a8;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = local_9f0;
            auVar94._16_8_ = uStack_7d0;
            auVar94._24_8_ = 0;
            auVar93._8_8_ = uStack_30b8;
            auVar93._0_8_ = local_30c0;
            auVar93._16_8_ = uStack_30b0;
            auVar93._24_8_ = uStack_30a8;
            auVar117 = vpunpcklbw_avx2(auVar94,auVar93);
            uStack_818 = 0;
            uStack_808 = 0;
            local_840 = local_30c0;
            uStack_838 = uStack_30b8;
            uStack_830 = uStack_30b0;
            uStack_828 = uStack_30a8;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = local_a00;
            auVar92._16_8_ = uStack_810;
            auVar92._24_8_ = 0;
            auVar91._8_8_ = uStack_30b8;
            auVar91._0_8_ = local_30c0;
            auVar91._16_8_ = uStack_30b0;
            auVar91._24_8_ = uStack_30a8;
            auVar118 = vpunpcklbw_avx2(auVar92,auVar91);
            local_3740 = auVar117._0_8_;
            uStack_3738 = auVar117._8_8_;
            uStack_3730 = auVar117._16_8_;
            uStack_3728 = auVar117._24_8_;
            local_2400 = local_3740;
            uStack_23f8 = uStack_3738;
            uStack_23f0 = uStack_3730;
            uStack_23e8 = uStack_3728;
            local_2404 = 4;
            auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
            local_3760 = auVar118._0_8_;
            uStack_3758 = auVar118._8_8_;
            uStack_3750 = auVar118._16_8_;
            uStack_3748 = auVar118._24_8_;
            local_2440 = local_3760;
            uStack_2438 = uStack_3758;
            uStack_2430 = uStack_3750;
            uStack_2428 = uStack_3748;
            local_2444 = 4;
            auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
            local_3740 = auVar117._0_8_;
            uStack_3738 = auVar117._8_8_;
            uStack_3730 = auVar117._16_8_;
            uStack_3728 = auVar117._24_8_;
            local_2f80 = local_3740;
            uStack_2f78 = uStack_3738;
            uStack_2f70 = uStack_3730;
            uStack_2f68 = uStack_3728;
            local_2fa0 = local_3100;
            lStack_2f98 = lStack_30f8;
            lStack_2f90 = lStack_30f0;
            lStack_2f88 = lStack_30e8;
            auVar4._8_8_ = lStack_30f8;
            auVar4._0_8_ = local_3100;
            auVar4._16_8_ = lStack_30f0;
            auVar4._24_8_ = lStack_30e8;
            vpaddw_avx2(auVar117,auVar4);
            local_3760 = auVar118._0_8_;
            uStack_3758 = auVar118._8_8_;
            uStack_3750 = auVar118._16_8_;
            uStack_3748 = auVar118._24_8_;
            local_2fc0 = local_3760;
            uStack_2fb8 = uStack_3758;
            uStack_2fb0 = uStack_3750;
            uStack_2fa8 = uStack_3748;
            local_2fe0 = local_3100;
            lStack_2fd8 = lStack_30f8;
            lStack_2fd0 = lStack_30f0;
            lStack_2fc8 = lStack_30e8;
            auVar3._8_8_ = lStack_30f8;
            auVar3._0_8_ = local_3100;
            auVar3._16_8_ = lStack_30f0;
            auVar3._24_8_ = lStack_30e8;
            auVar117 = vpaddw_avx2(auVar118,auVar3);
            local_820 = local_a00;
            local_7e0 = local_9f0;
            local_340 = uStack_810;
            local_320 = local_a00;
            local_300 = uStack_7d0;
            local_2e0 = local_9f0;
            load_line2_avx2(local_3058,(void *)((long)*local_3058 + (long)(int)local_305c * 2),
                            (void *)(ulong)local_3034);
            load_line2_avx2((__m256i *)((long)*local_3058 + (long)(int)(local_305c * 2) * 2),
                            (void *)((long)*local_3058 + (long)(int)(local_305c * 3) * 2),
                            (void *)(ulong)local_305c);
            comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                     in_stack_ffffffffffffc67c);
            comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                     in_stack_ffffffffffffc67c);
            plVar105 = &local_3100;
            iVar152 = (int)((ulong)local_3140 >> 0x20);
            convolve_rounding(in_stack_ffffffffffffc5d0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8),
                              in_stack_ffffffffffffc5c0,iVar152);
            auVar118 = auVar117;
            convolve_rounding(in_stack_ffffffffffffc5d0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8),
                              in_stack_ffffffffffffc5c0,iVar152);
            local_37c0 = auVar117._0_8_;
            uStack_37b8 = auVar117._8_8_;
            uStack_37b0 = auVar117._16_8_;
            uStack_37a8 = auVar117._24_8_;
            local_37e0 = auVar118._0_8_;
            uStack_37d8 = auVar118._8_8_;
            uStack_37d0 = auVar118._16_8_;
            uStack_37c8 = auVar118._24_8_;
            local_18c0 = local_37c0;
            uStack_18b8 = uStack_37b8;
            uStack_18b0 = uStack_37b0;
            uStack_18a8 = uStack_37a8;
            local_18e0 = local_37e0;
            uStack_18d8 = uStack_37d8;
            uStack_18d0 = uStack_37d0;
            uStack_18c8 = uStack_37c8;
            auVar117 = vpackuswb_avx2(auVar117,auVar118);
            local_3800 = auVar117._0_8_;
            uStack_37f8 = auVar117._8_8_;
            uStack_37f0 = auVar117._16_8_;
            uStack_37e8 = auVar117._24_8_;
            local_1300 = local_3800;
            uStack_12f8 = uStack_37f8;
            uStack_12f0 = uStack_37f0;
            uStack_12e8 = uStack_37e8;
            uStack_ff8 = uStack_37e8;
            local_1000 = uStack_37f0;
            local_fe8 = local_3040;
            *local_3040 = uStack_37f0;
            local_1008 = (undefined8 *)((long)local_3040 + (long)local_3044);
            *local_1008 = local_3820;
            s_01[1] = extraout_RDX_01;
            s_01[0] = (longlong)plVar105;
            _mm_storeh_epi64((__m128i *)((long)local_3040 + (long)(local_3044 << 1)),s_01);
            s_02[1] = extraout_RDX_02;
            s_02[0] = (longlong)plVar105;
            _mm_storeh_epi64((__m128i *)((long)local_3040 + (long)(local_3044 * 3)),s_02);
            local_3504 = local_3504 + -4;
            local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 2));
            local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 2) * 2);
            local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 2));
          } while (local_3504 != 0);
        }
        else {
          do {
            uVar101 = loadu_int32(local_3030);
            iVar102 = loadu_int32(*local_3030 + (int)local_3034);
            uVar103 = loadu_int32(*local_3030 + (int)(local_3034 * 2));
            local_238 = loadu_int32(*local_3030 + (int)(local_3034 * 3));
            local_22c = 0;
            local_230 = 0;
            local_23c = 0;
            local_240 = 0;
            local_c4 = 0;
            local_c8 = 0;
            local_d4 = 0;
            local_d8 = 0;
            auVar116 = vpinsrd_avx(ZEXT416(uVar101),iVar102,1);
            auVar116 = vpinsrd_avx(auVar116,0,2);
            local_100 = vpinsrd_avx(auVar116,0,3);
            auVar116 = vpinsrd_avx(ZEXT416(uVar103),local_238,1);
            auVar116 = vpinsrd_avx(auVar116,0,2);
            auStack_f0 = vpinsrd_avx(auVar116,0,3);
            local_860 = local_100._0_8_;
            uStack_858 = local_100._8_8_;
            uStack_850 = auStack_f0._0_8_;
            uStack_848 = auStack_f0._8_8_;
            local_880 = local_30c0;
            uStack_878 = uStack_30b8;
            uStack_870 = uStack_30b0;
            uStack_868 = uStack_30a8;
            auVar90._16_8_ = auStack_f0._0_8_;
            auVar90._0_16_ = local_100;
            auVar90._24_8_ = auStack_f0._8_8_;
            auVar2._8_8_ = uStack_30b8;
            auVar2._0_8_ = local_30c0;
            auVar2._16_8_ = uStack_30b0;
            auVar2._24_8_ = uStack_30a8;
            auVar117 = vpunpcklbw_avx2(auVar90,auVar2);
            local_3860 = auVar117._0_8_;
            uStack_3858 = auVar117._8_8_;
            uStack_3850 = auVar117._16_8_;
            uStack_3848 = auVar117._24_8_;
            local_2480 = local_3860;
            uStack_2478 = uStack_3858;
            uStack_2470 = uStack_3850;
            uStack_2468 = uStack_3848;
            local_2484 = 4;
            auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
            local_3860 = auVar117._0_8_;
            uStack_3858 = auVar117._8_8_;
            uStack_3850 = auVar117._16_8_;
            uStack_3848 = auVar117._24_8_;
            local_3000 = local_3860;
            uStack_2ff8 = uStack_3858;
            uStack_2ff0 = uStack_3850;
            uStack_2fe8 = uStack_3848;
            local_3020 = local_3100;
            lStack_3018 = lStack_30f8;
            lStack_3010 = lStack_30f0;
            lStack_3008 = lStack_30e8;
            auVar118._8_8_ = lStack_30f8;
            auVar118._0_8_ = local_3100;
            auVar118._16_8_ = lStack_30f0;
            auVar118._24_8_ = lStack_30e8;
            vpaddw_avx2(auVar117,auVar118);
            local_1e8 = (*local_3058)[0];
            local_1f0 = *(ulong *)((long)*local_3058 + (long)(int)local_305c * 2);
            local_1f8 = *(ulong *)((long)*local_3058 + (long)(int)(local_305c * 2) * 2);
            local_200 = *(ulong *)((long)*local_3058 + (long)(int)(local_305c * 3) * 2);
            auVar116._8_8_ = 0;
            auVar116._0_8_ = local_1e8;
            auVar148._8_8_ = 0;
            auVar148._0_8_ = local_1f0;
            local_80 = vpunpcklqdq_avx(auVar116,auVar148);
            auVar149._8_8_ = 0;
            auVar149._0_8_ = local_1f8;
            auVar151._8_8_ = 0;
            auVar151._0_8_ = local_200;
            auStack_70 = vpunpcklqdq_avx(auVar149,auVar151);
            uVar111 = local_80._0_8_;
            uVar124 = local_80._8_8_;
            uVar133 = auStack_70._0_8_;
            uVar142 = auStack_70._8_8_;
            local_234 = uVar103;
            local_228 = iVar102;
            local_224 = uVar101;
            local_e0 = uVar101;
            local_dc = iVar102;
            local_d0 = uVar103;
            local_cc = local_238;
            local_50 = local_1e8;
            local_48 = local_1f0;
            local_40 = local_1f8;
            local_38 = local_200;
            comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                     in_stack_ffffffffffffc67c);
            convolve_rounding(in_stack_ffffffffffffc5d0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8),
                              in_stack_ffffffffffffc5c0,iVar152);
            local_38a0._8_8_ = uVar124;
            local_38a0._0_8_ = uVar111;
            auVar1._16_8_ = uVar133;
            auVar1._0_16_ = local_38a0;
            auVar1._24_8_ = uVar142;
            auVar117._16_8_ = uVar133;
            auVar117._0_16_ = local_38a0;
            auVar117._24_8_ = uVar142;
            auVar117 = vpackuswb_avx2(auVar1,auVar117);
            local_38a0._0_8_ = auVar117._0_8_;
            local_1320 = local_38a0._0_8_;
            local_38a0._8_8_ = auVar117._8_8_;
            uStack_1318 = local_38a0._8_8_;
            uStack_3890 = auVar117._16_8_;
            uStack_1310 = uStack_3890;
            uStack_3888 = auVar117._24_8_;
            uStack_1308 = uStack_3888;
            uStack_f78 = uStack_3888;
            local_f70 = uStack_3890;
            local_f80._0_4_ = auVar117._16_4_;
            *(undefined4 *)local_3040 = (undefined4)local_f80;
            *(undefined4 *)((long)local_3040 + (long)(local_3044 * 2)) = local_38c0;
            uStack_38ac = auVar117._20_4_;
            *(undefined4 *)((long)local_3040 + (long)local_3044) = uStack_38ac;
            *(undefined4 *)((long)local_3040 + (long)(local_3044 * 3)) = uStack_38bc;
            local_3504 = local_3504 + -4;
            local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 2));
            local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 2) * 2);
            local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 2));
            local_1920 = uVar111;
            uStack_1918 = uVar124;
            uStack_1910 = uVar133;
            uStack_1908 = uVar142;
            local_1900 = uVar111;
            uStack_18f8 = uVar124;
            uStack_18f0 = uVar133;
            uStack_18e8 = uVar142;
            local_f80 = local_f70;
            uStack_f68 = uStack_f78;
          } while (local_3504 != 0);
        }
      }
      else if (local_3048 == 0x80) {
        do {
          local_928 = local_3030;
          local_490 = *(undefined8 *)*local_3030;
          uStack_488 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_930 = local_3030 + 1;
          local_4a0 = *(undefined8 *)*local_930;
          uStack_498 = *(undefined8 *)(local_3030[1] + 8);
          auVar118 = vpmovzxbw_avx2(*local_930);
          local_938 = local_3030 + 2;
          local_4b0 = *(undefined8 *)*local_938;
          uStack_4a8 = *(undefined8 *)(local_3030[2] + 8);
          auVar1 = vpmovzxbw_avx2(*local_938);
          local_940 = local_3030 + 3;
          local_4c0 = *(undefined8 *)*local_940;
          uStack_4b8 = *(undefined8 *)(local_3030[3] + 8);
          auVar2 = vpmovzxbw_avx2(*local_940);
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_1f00 = local_3540;
          uStack_1ef8 = uStack_3538;
          uStack_1ef0 = uStack_3530;
          uStack_1ee8 = uStack_3528;
          local_1f04 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_1f40 = local_3560;
          uStack_1f38 = uStack_3558;
          uStack_1f30 = uStack_3550;
          uStack_1f28 = uStack_3548;
          local_1f44 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_1f80 = local_3580;
          uStack_1f78 = uStack_3578;
          uStack_1f70 = uStack_3570;
          uStack_1f68 = uStack_3568;
          local_1f84 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_1fc0 = local_35a0;
          uStack_1fb8 = uStack_3598;
          uStack_1fb0 = uStack_3590;
          uStack_1fa8 = uStack_3588;
          local_1fc4 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2a80 = local_3540;
          uStack_2a78 = uStack_3538;
          uStack_2a70 = uStack_3530;
          uStack_2a68 = uStack_3528;
          local_2aa0 = local_3100;
          lStack_2a98 = lStack_30f8;
          lStack_2a90 = lStack_30f0;
          lStack_2a88 = lStack_30e8;
          auVar24._8_8_ = lStack_30f8;
          auVar24._0_8_ = local_3100;
          auVar24._16_8_ = lStack_30f0;
          auVar24._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar24);
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2ac0 = local_3560;
          uStack_2ab8 = uStack_3558;
          uStack_2ab0 = uStack_3550;
          uStack_2aa8 = uStack_3548;
          local_2ae0 = local_3100;
          lStack_2ad8 = lStack_30f8;
          lStack_2ad0 = lStack_30f0;
          lStack_2ac8 = lStack_30e8;
          auVar23._8_8_ = lStack_30f8;
          auVar23._0_8_ = local_3100;
          auVar23._16_8_ = lStack_30f0;
          auVar23._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar23);
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2b00 = local_3580;
          uStack_2af8 = uStack_3578;
          uStack_2af0 = uStack_3570;
          uStack_2ae8 = uStack_3568;
          local_2b20 = local_3100;
          lStack_2b18 = lStack_30f8;
          lStack_2b10 = lStack_30f0;
          lStack_2b08 = lStack_30e8;
          auVar22._8_8_ = lStack_30f8;
          auVar22._0_8_ = local_3100;
          auVar22._16_8_ = lStack_30f0;
          auVar22._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar22);
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_2b40 = local_35a0;
          uStack_2b38 = uStack_3598;
          uStack_2b30 = uStack_3590;
          uStack_2b28 = uStack_3588;
          local_2b60 = local_3100;
          lStack_2b58 = lStack_30f8;
          lStack_2b50 = lStack_30f0;
          lStack_2b48 = lStack_30e8;
          auVar21._8_8_ = lStack_30f8;
          auVar21._0_8_ = local_3100;
          auVar21._16_8_ = lStack_30f0;
          auVar21._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar21);
          local_668 = local_3058;
          local_670 = local_3058 + 1;
          local_678 = local_3058 + 2;
          local_680 = local_3058 + 3;
          lVar106 = (*local_680)[0];
          lVar119 = local_3058[3][1];
          lVar128 = local_3058[3][2];
          lVar137 = local_3058[3][3];
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar107 = lVar106;
          lVar120 = lVar119;
          lVar129 = lVar128;
          lVar138 = lVar137;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar108 = lVar107;
          lVar121 = lVar120;
          lVar130 = lVar129;
          lVar139 = lVar138;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar109 = lVar108;
          lVar122 = lVar121;
          lVar131 = lVar130;
          lVar140 = lVar139;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar67._8_8_ = lVar119;
          auVar67._0_8_ = lVar106;
          auVar67._16_8_ = lVar128;
          auVar67._24_8_ = lVar137;
          auVar66._8_8_ = lVar120;
          auVar66._0_8_ = lVar107;
          auVar66._16_8_ = lVar129;
          auVar66._24_8_ = lVar138;
          auVar117 = vpackuswb_avx2(auVar67,auVar66);
          auVar65._8_8_ = lVar121;
          auVar65._0_8_ = lVar108;
          auVar65._16_8_ = lVar130;
          auVar65._24_8_ = lVar139;
          auVar64._8_8_ = lVar122;
          auVar64._0_8_ = lVar109;
          auVar64._16_8_ = lVar131;
          auVar64._24_8_ = lVar140;
          auVar118 = vpackuswb_avx2(auVar65,auVar64);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_36c0 = auVar117._0_8_;
          uStack_36b8 = auVar117._8_8_;
          uStack_36b0 = auVar117._16_8_;
          puStack_36a8 = auVar117._24_8_;
          local_11c0 = local_36c0;
          uStack_11b8 = uStack_36b8;
          uStack_11b0 = uStack_36b0;
          puStack_11a8 = puStack_36a8;
          local_ca8 = local_3040;
          local_cc0 = local_36c0;
          uStack_cb8 = uStack_36b8;
          *local_3040 = local_36c0;
          local_3040[1] = uStack_36b8;
          local_cc8 = puStack_36a8;
          uStack_cd0 = uStack_36b0;
          *puStack_36a8 = local_ce0;
          puStack_36a8[1] = uStack_cd8;
          local_ce8 = local_3040 + 4;
          local_36e0 = auVar118._0_8_;
          uStack_36d8 = auVar118._8_8_;
          uStack_36d0 = auVar118._16_8_;
          uStack_36c8 = auVar118._24_8_;
          local_11e0 = local_36e0;
          uStack_11d8 = uStack_36d8;
          uStack_11d0 = uStack_36d0;
          uStack_11c8 = uStack_36c8;
          local_d00 = local_36e0;
          uStack_cf8 = uStack_36d8;
          *local_ce8 = local_36e0;
          local_3040[5] = uStack_36d8;
          local_d08 = local_3040 + 6;
          local_d20 = uStack_36d0;
          uStack_d18 = uStack_36c8;
          *local_d08 = uStack_36d0;
          local_3040[7] = uStack_36c8;
          local_948 = local_3030 + 4;
          local_4d0 = *(undefined8 *)*local_948;
          uStack_4c8 = *(undefined8 *)(local_3030[4] + 8);
          auVar117 = vpmovzxbw_avx2(*local_948);
          local_950 = local_3030 + 5;
          local_4e0 = *(undefined8 *)*local_950;
          uStack_4d8 = *(undefined8 *)(local_3030[5] + 8);
          auVar118 = vpmovzxbw_avx2(*local_950);
          local_958 = local_3030 + 6;
          local_4f0 = *(undefined8 *)*local_958;
          uStack_4e8 = *(undefined8 *)(local_3030[6] + 8);
          auVar1 = vpmovzxbw_avx2(*local_958);
          local_960 = local_3030 + 7;
          local_500 = *(undefined8 *)*local_960;
          uStack_4f8 = *(undefined8 *)(local_3030[7] + 8);
          auVar2 = vpmovzxbw_avx2(*local_960);
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2000 = local_3540;
          uStack_1ff8 = uStack_3538;
          uStack_1ff0 = uStack_3530;
          uStack_1fe8 = uStack_3528;
          local_2004 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2040 = local_3560;
          uStack_2038 = uStack_3558;
          uStack_2030 = uStack_3550;
          uStack_2028 = uStack_3548;
          local_2044 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2080 = local_3580;
          uStack_2078 = uStack_3578;
          uStack_2070 = uStack_3570;
          uStack_2068 = uStack_3568;
          local_2084 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_20c0 = local_35a0;
          uStack_20b8 = uStack_3598;
          uStack_20b0 = uStack_3590;
          uStack_20a8 = uStack_3588;
          local_20c4 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2b80 = local_3540;
          uStack_2b78 = uStack_3538;
          uStack_2b70 = uStack_3530;
          uStack_2b68 = uStack_3528;
          local_2ba0 = local_3100;
          lStack_2b98 = lStack_30f8;
          lStack_2b90 = lStack_30f0;
          lStack_2b88 = lStack_30e8;
          auVar20._8_8_ = lStack_30f8;
          auVar20._0_8_ = local_3100;
          auVar20._16_8_ = lStack_30f0;
          auVar20._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar20);
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2bc0 = local_3560;
          uStack_2bb8 = uStack_3558;
          uStack_2bb0 = uStack_3550;
          uStack_2ba8 = uStack_3548;
          local_2be0 = local_3100;
          lStack_2bd8 = lStack_30f8;
          lStack_2bd0 = lStack_30f0;
          lStack_2bc8 = lStack_30e8;
          auVar19._8_8_ = lStack_30f8;
          auVar19._0_8_ = local_3100;
          auVar19._16_8_ = lStack_30f0;
          auVar19._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar19);
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2c00 = local_3580;
          uStack_2bf8 = uStack_3578;
          uStack_2bf0 = uStack_3570;
          uStack_2be8 = uStack_3568;
          local_2c20 = local_3100;
          lStack_2c18 = lStack_30f8;
          lStack_2c10 = lStack_30f0;
          lStack_2c08 = lStack_30e8;
          auVar18._8_8_ = lStack_30f8;
          auVar18._0_8_ = local_3100;
          auVar18._16_8_ = lStack_30f0;
          auVar18._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar18);
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_2c40 = local_35a0;
          uStack_2c38 = uStack_3598;
          uStack_2c30 = uStack_3590;
          uStack_2c28 = uStack_3588;
          local_2c60 = local_3100;
          lStack_2c58 = lStack_30f8;
          lStack_2c50 = lStack_30f0;
          lStack_2c48 = lStack_30e8;
          auVar17._8_8_ = lStack_30f8;
          auVar17._0_8_ = local_3100;
          auVar17._16_8_ = lStack_30f0;
          auVar17._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar17);
          local_688 = local_3058 + 4;
          local_690 = local_3058 + 5;
          local_698 = local_3058 + 6;
          local_6a0 = local_3058 + 7;
          lVar110 = (*local_6a0)[0];
          lVar123 = local_3058[7][1];
          lVar132 = local_3058[7][2];
          lVar141 = local_3058[7][3];
          local_16a0 = lVar109;
          lStack_1698 = lVar122;
          lStack_1690 = lVar131;
          lStack_1688 = lVar140;
          local_1680 = lVar108;
          lStack_1678 = lVar121;
          lStack_1670 = lVar130;
          lStack_1668 = lVar139;
          local_1660 = lVar107;
          lStack_1658 = lVar120;
          lStack_1650 = lVar129;
          lStack_1648 = lVar138;
          local_1640 = lVar106;
          lStack_1638 = lVar119;
          lStack_1630 = lVar128;
          lStack_1628 = lVar137;
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar106 = lVar110;
          lVar119 = lVar123;
          lVar128 = lVar132;
          lVar137 = lVar141;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar107 = lVar106;
          lVar120 = lVar119;
          lVar129 = lVar128;
          lVar138 = lVar137;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar108 = lVar107;
          lVar121 = lVar120;
          lVar130 = lVar129;
          lVar139 = lVar138;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar63._8_8_ = lVar123;
          auVar63._0_8_ = lVar110;
          auVar63._16_8_ = lVar132;
          auVar63._24_8_ = lVar141;
          auVar62._8_8_ = lVar119;
          auVar62._0_8_ = lVar106;
          auVar62._16_8_ = lVar128;
          auVar62._24_8_ = lVar137;
          auVar117 = vpackuswb_avx2(auVar63,auVar62);
          auVar61._8_8_ = lVar120;
          auVar61._0_8_ = lVar107;
          auVar61._16_8_ = lVar129;
          auVar61._24_8_ = lVar138;
          auVar60._8_8_ = lVar121;
          auVar60._0_8_ = lVar108;
          auVar60._16_8_ = lVar130;
          auVar60._24_8_ = lVar139;
          auVar118 = vpackuswb_avx2(auVar61,auVar60);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_d28 = local_3040 + 8;
          local_36c0 = auVar117._0_8_;
          local_1200 = local_36c0;
          uStack_36b8 = auVar117._8_8_;
          uStack_11f8 = uStack_36b8;
          uStack_36b0 = auVar117._16_8_;
          uStack_11f0 = uStack_36b0;
          puStack_36a8 = auVar117._24_8_;
          puStack_11e8 = puStack_36a8;
          local_d40 = local_36c0;
          uStack_d38 = uStack_36b8;
          *local_d28 = local_36c0;
          local_3040[9] = uStack_36b8;
          local_d48 = puStack_36a8;
          uStack_d50 = uStack_36b0;
          *puStack_36a8 = local_d60;
          puStack_36a8[1] = uStack_d58;
          local_d68 = local_3040 + 0xc;
          local_36e0 = auVar118._0_8_;
          local_1220 = local_36e0;
          uStack_36d8 = auVar118._8_8_;
          uStack_1218 = uStack_36d8;
          uStack_36d0 = auVar118._16_8_;
          uStack_1210 = uStack_36d0;
          uStack_36c8 = auVar118._24_8_;
          uStack_1208 = uStack_36c8;
          local_d80 = local_36e0;
          uStack_d78 = uStack_36d8;
          *local_d68 = local_36e0;
          local_3040[0xd] = uStack_36d8;
          local_d88 = local_3040 + 0xe;
          local_da0 = uStack_36d0;
          uStack_d98 = uStack_36c8;
          *local_d88 = uStack_36d0;
          local_3040[0xf] = uStack_36c8;
          local_3504 = local_3504 + -1;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)local_305c * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)local_3044);
          local_1720 = lVar108;
          lStack_1718 = lVar121;
          lStack_1710 = lVar130;
          lStack_1708 = lVar139;
          local_1700 = lVar107;
          lStack_16f8 = lVar120;
          lStack_16f0 = lVar129;
          lStack_16e8 = lVar138;
          local_16e0 = lVar106;
          lStack_16d8 = lVar119;
          lStack_16d0 = lVar128;
          lStack_16c8 = lVar137;
          local_16c0 = lVar110;
          lStack_16b8 = lVar123;
          lStack_16b0 = lVar132;
          lStack_16a8 = lVar141;
        } while (local_3504 != 0);
      }
      else if (local_3048 == 0x40) {
        do {
          local_968 = local_3030;
          local_510 = *(undefined8 *)*local_3030;
          uStack_508 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_970 = local_3030 + 1;
          local_520 = *(undefined8 *)*local_970;
          uStack_518 = *(undefined8 *)(local_3030[1] + 8);
          auVar118 = vpmovzxbw_avx2(*local_970);
          local_978 = local_3030 + 2;
          local_530 = *(undefined8 *)*local_978;
          uStack_528 = *(undefined8 *)(local_3030[2] + 8);
          auVar1 = vpmovzxbw_avx2(*local_978);
          local_980 = local_3030 + 3;
          local_540 = *(undefined8 *)*local_980;
          uStack_538 = *(undefined8 *)(local_3030[3] + 8);
          auVar2 = vpmovzxbw_avx2(*local_980);
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2100 = local_3540;
          uStack_20f8 = uStack_3538;
          uStack_20f0 = uStack_3530;
          uStack_20e8 = uStack_3528;
          local_2104 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2140 = local_3560;
          uStack_2138 = uStack_3558;
          uStack_2130 = uStack_3550;
          uStack_2128 = uStack_3548;
          local_2144 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2180 = local_3580;
          uStack_2178 = uStack_3578;
          uStack_2170 = uStack_3570;
          uStack_2168 = uStack_3568;
          local_2184 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_21c0 = local_35a0;
          uStack_21b8 = uStack_3598;
          uStack_21b0 = uStack_3590;
          uStack_21a8 = uStack_3588;
          local_21c4 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2c80 = local_3540;
          uStack_2c78 = uStack_3538;
          uStack_2c70 = uStack_3530;
          uStack_2c68 = uStack_3528;
          local_2ca0 = local_3100;
          lStack_2c98 = lStack_30f8;
          lStack_2c90 = lStack_30f0;
          lStack_2c88 = lStack_30e8;
          auVar16._8_8_ = lStack_30f8;
          auVar16._0_8_ = local_3100;
          auVar16._16_8_ = lStack_30f0;
          auVar16._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar16);
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2cc0 = local_3560;
          uStack_2cb8 = uStack_3558;
          uStack_2cb0 = uStack_3550;
          uStack_2ca8 = uStack_3548;
          local_2ce0 = local_3100;
          lStack_2cd8 = lStack_30f8;
          lStack_2cd0 = lStack_30f0;
          lStack_2cc8 = lStack_30e8;
          auVar15._8_8_ = lStack_30f8;
          auVar15._0_8_ = local_3100;
          auVar15._16_8_ = lStack_30f0;
          auVar15._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar15);
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2d00 = local_3580;
          uStack_2cf8 = uStack_3578;
          uStack_2cf0 = uStack_3570;
          uStack_2ce8 = uStack_3568;
          local_2d20 = local_3100;
          lStack_2d18 = lStack_30f8;
          lStack_2d10 = lStack_30f0;
          lStack_2d08 = lStack_30e8;
          auVar14._8_8_ = lStack_30f8;
          auVar14._0_8_ = local_3100;
          auVar14._16_8_ = lStack_30f0;
          auVar14._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar14);
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_2d40 = local_35a0;
          uStack_2d38 = uStack_3598;
          uStack_2d30 = uStack_3590;
          uStack_2d28 = uStack_3588;
          local_2d60 = local_3100;
          lStack_2d58 = lStack_30f8;
          lStack_2d50 = lStack_30f0;
          lStack_2d48 = lStack_30e8;
          auVar13._8_8_ = lStack_30f8;
          auVar13._0_8_ = local_3100;
          auVar13._16_8_ = lStack_30f0;
          auVar13._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar13);
          local_6a8 = local_3058;
          local_6b0 = local_3058 + 1;
          local_6b8 = local_3058 + 2;
          local_6c0 = local_3058 + 3;
          lVar106 = (*local_6c0)[0];
          lVar119 = local_3058[3][1];
          lVar128 = local_3058[3][2];
          lVar137 = local_3058[3][3];
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar110 = lVar106;
          lVar123 = lVar119;
          lVar132 = lVar128;
          lVar141 = lVar137;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar107 = lVar110;
          lVar120 = lVar123;
          lVar129 = lVar132;
          lVar138 = lVar141;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar108 = lVar107;
          lVar121 = lVar120;
          lVar130 = lVar129;
          lVar139 = lVar138;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar59._8_8_ = lVar119;
          auVar59._0_8_ = lVar106;
          auVar59._16_8_ = lVar128;
          auVar59._24_8_ = lVar137;
          auVar58._8_8_ = lVar123;
          auVar58._0_8_ = lVar110;
          auVar58._16_8_ = lVar132;
          auVar58._24_8_ = lVar141;
          auVar117 = vpackuswb_avx2(auVar59,auVar58);
          auVar57._8_8_ = lVar120;
          auVar57._0_8_ = lVar107;
          auVar57._16_8_ = lVar129;
          auVar57._24_8_ = lVar138;
          auVar56._8_8_ = lVar121;
          auVar56._0_8_ = lVar108;
          auVar56._16_8_ = lVar130;
          auVar56._24_8_ = lVar139;
          auVar118 = vpackuswb_avx2(auVar57,auVar56);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_da8 = local_3040;
          local_36c0 = auVar117._0_8_;
          local_1240 = local_36c0;
          uStack_36b8 = auVar117._8_8_;
          uStack_1238 = uStack_36b8;
          uStack_36b0 = auVar117._16_8_;
          uStack_1230 = uStack_36b0;
          puStack_36a8 = auVar117._24_8_;
          puStack_1228 = puStack_36a8;
          local_dc0 = local_36c0;
          uStack_db8 = uStack_36b8;
          *local_3040 = local_36c0;
          local_3040[1] = uStack_36b8;
          local_dc8 = puStack_36a8;
          uStack_dd0 = uStack_36b0;
          *puStack_36a8 = local_de0;
          puStack_36a8[1] = uStack_dd8;
          local_de8 = local_3040 + 4;
          local_36e0 = auVar118._0_8_;
          local_1260 = local_36e0;
          uStack_36d8 = auVar118._8_8_;
          uStack_1258 = uStack_36d8;
          uStack_36d0 = auVar118._16_8_;
          uStack_1250 = uStack_36d0;
          uStack_36c8 = auVar118._24_8_;
          uStack_1248 = uStack_36c8;
          local_e00 = local_36e0;
          uStack_df8 = uStack_36d8;
          *local_de8 = local_36e0;
          local_3040[5] = uStack_36d8;
          local_e08 = local_3040 + 6;
          local_e20 = uStack_36d0;
          uStack_e18 = uStack_36c8;
          *local_e08 = uStack_36d0;
          local_3040[7] = uStack_36c8;
          local_3504 = local_3504 + -1;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)local_305c * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)local_3044);
          local_17a0 = lVar108;
          lStack_1798 = lVar121;
          lStack_1790 = lVar130;
          lStack_1788 = lVar139;
          local_1780 = lVar107;
          lStack_1778 = lVar120;
          lStack_1770 = lVar129;
          lStack_1768 = lVar138;
          local_1760 = lVar110;
          lStack_1758 = lVar123;
          lStack_1750 = lVar132;
          lStack_1748 = lVar141;
          local_1740 = lVar106;
          lStack_1738 = lVar119;
          lStack_1730 = lVar128;
          lStack_1728 = lVar137;
        } while (local_3504 != 0);
      }
      else if (local_3048 == 0x20) {
        do {
          local_988 = local_3030;
          local_550 = *(undefined8 *)*local_3030;
          uStack_548 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_990 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_560 = *(undefined8 *)*local_990;
          uStack_558 = *(undefined8 *)(*local_990 + 8);
          auVar118 = vpmovzxbw_avx2(*local_990);
          local_998 = local_3030 + 1;
          local_570 = *(undefined8 *)*local_998;
          uStack_568 = *(undefined8 *)(local_3030[1] + 8);
          auVar1 = vpmovzxbw_avx2(*local_998);
          local_9a0 = (undefined1 (*) [16])(local_3030[1] + (int)local_3034);
          local_580 = *(undefined8 *)*local_9a0;
          uStack_578 = *(undefined8 *)(*local_9a0 + 8);
          auVar2 = vpmovzxbw_avx2(*local_9a0);
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2200 = local_3540;
          uStack_21f8 = uStack_3538;
          uStack_21f0 = uStack_3530;
          uStack_21e8 = uStack_3528;
          local_2204 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2240 = local_3560;
          uStack_2238 = uStack_3558;
          uStack_2230 = uStack_3550;
          uStack_2228 = uStack_3548;
          local_2244 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2280 = local_3580;
          uStack_2278 = uStack_3578;
          uStack_2270 = uStack_3570;
          uStack_2268 = uStack_3568;
          local_2284 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_22c0 = local_35a0;
          uStack_22b8 = uStack_3598;
          uStack_22b0 = uStack_3590;
          uStack_22a8 = uStack_3588;
          local_22c4 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2d80 = local_3540;
          uStack_2d78 = uStack_3538;
          uStack_2d70 = uStack_3530;
          uStack_2d68 = uStack_3528;
          local_2da0 = local_3100;
          lStack_2d98 = lStack_30f8;
          lStack_2d90 = lStack_30f0;
          lStack_2d88 = lStack_30e8;
          auVar12._8_8_ = lStack_30f8;
          auVar12._0_8_ = local_3100;
          auVar12._16_8_ = lStack_30f0;
          auVar12._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar12);
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2dc0 = local_3560;
          uStack_2db8 = uStack_3558;
          uStack_2db0 = uStack_3550;
          uStack_2da8 = uStack_3548;
          local_2de0 = local_3100;
          lStack_2dd8 = lStack_30f8;
          lStack_2dd0 = lStack_30f0;
          lStack_2dc8 = lStack_30e8;
          auVar11._8_8_ = lStack_30f8;
          auVar11._0_8_ = local_3100;
          auVar11._16_8_ = lStack_30f0;
          auVar11._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar11);
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2e00 = local_3580;
          uStack_2df8 = uStack_3578;
          uStack_2df0 = uStack_3570;
          uStack_2de8 = uStack_3568;
          local_2e20 = local_3100;
          lStack_2e18 = lStack_30f8;
          lStack_2e10 = lStack_30f0;
          lStack_2e08 = lStack_30e8;
          auVar10._8_8_ = lStack_30f8;
          auVar10._0_8_ = local_3100;
          auVar10._16_8_ = lStack_30f0;
          auVar10._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar10);
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_2e40 = local_35a0;
          uStack_2e38 = uStack_3598;
          uStack_2e30 = uStack_3590;
          uStack_2e28 = uStack_3588;
          local_2e60 = local_3100;
          lStack_2e58 = lStack_30f8;
          lStack_2e50 = lStack_30f0;
          lStack_2e48 = lStack_30e8;
          auVar9._8_8_ = lStack_30f8;
          auVar9._0_8_ = local_3100;
          auVar9._16_8_ = lStack_30f0;
          auVar9._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar9);
          local_6c8 = local_3058;
          local_6d0 = (long)*local_3058 + (long)(int)local_305c * 2;
          local_6d8 = local_3058 + 1;
          local_6e0 = (undefined8 *)((long)local_3058[1] + (long)(int)local_305c * 2);
          uVar111 = *local_6e0;
          uVar124 = local_6e0[1];
          uVar133 = local_6e0[2];
          uVar142 = local_6e0[3];
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar112 = uVar111;
          uVar125 = uVar124;
          uVar134 = uVar133;
          uVar143 = uVar142;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar113 = uVar112;
          uVar126 = uVar125;
          uVar135 = uVar134;
          uVar144 = uVar143;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar114 = uVar113;
          uVar127 = uVar126;
          uVar136 = uVar135;
          uVar145 = uVar144;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar55._8_8_ = uVar124;
          auVar55._0_8_ = uVar111;
          auVar55._16_8_ = uVar133;
          auVar55._24_8_ = uVar142;
          auVar54._8_8_ = uVar125;
          auVar54._0_8_ = uVar112;
          auVar54._16_8_ = uVar134;
          auVar54._24_8_ = uVar143;
          auVar117 = vpackuswb_avx2(auVar55,auVar54);
          auVar53._8_8_ = uVar126;
          auVar53._0_8_ = uVar113;
          auVar53._16_8_ = uVar135;
          auVar53._24_8_ = uVar144;
          auVar52._8_8_ = uVar127;
          auVar52._0_8_ = uVar114;
          auVar52._16_8_ = uVar136;
          auVar52._24_8_ = uVar145;
          auVar118 = vpackuswb_avx2(auVar53,auVar52);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_e28 = local_3040;
          local_36c0 = auVar117._0_8_;
          local_1280 = local_36c0;
          uStack_36b8 = auVar117._8_8_;
          uStack_1278 = uStack_36b8;
          uStack_36b0 = auVar117._16_8_;
          uStack_1270 = uStack_36b0;
          puStack_36a8 = auVar117._24_8_;
          puStack_1268 = puStack_36a8;
          local_e40 = local_36c0;
          uStack_e38 = uStack_36b8;
          *local_3040 = local_36c0;
          local_3040[1] = uStack_36b8;
          local_e48 = puStack_36a8;
          uStack_e50 = uStack_36b0;
          *puStack_36a8 = local_e60;
          puStack_36a8[1] = uStack_e58;
          local_e68 = local_3040 + 2;
          local_36e0 = auVar118._0_8_;
          local_12a0 = local_36e0;
          uStack_36d8 = auVar118._8_8_;
          uStack_1298 = uStack_36d8;
          uStack_36d0 = auVar118._16_8_;
          uStack_1290 = uStack_36d0;
          uStack_36c8 = auVar118._24_8_;
          uStack_1288 = uStack_36c8;
          local_e80 = local_36e0;
          uStack_e78 = uStack_36d8;
          *local_e68 = local_36e0;
          local_3040[3] = uStack_36d8;
          local_e88 = (undefined8 *)((long)local_3044 + 0x10 + (long)local_3040);
          local_ea0 = uStack_36d0;
          uStack_e98 = uStack_36c8;
          *local_e88 = uStack_36d0;
          local_e88[1] = uStack_36c8;
          local_3504 = local_3504 + -2;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 1));
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 1) * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 1));
          local_1820 = uVar114;
          uStack_1818 = uVar127;
          uStack_1810 = uVar136;
          uStack_1808 = uVar145;
          local_1800 = uVar113;
          uStack_17f8 = uVar126;
          uStack_17f0 = uVar135;
          uStack_17e8 = uVar144;
          local_17e0 = uVar112;
          uStack_17d8 = uVar125;
          uStack_17d0 = uVar134;
          uStack_17c8 = uVar143;
          local_17c0 = uVar111;
          uStack_17b8 = uVar124;
          uStack_17b0 = uVar133;
          uStack_17a8 = uVar142;
        } while (local_3504 != 0);
      }
      else {
        do {
          local_9a8 = local_3030;
          local_590 = *(undefined8 *)*local_3030;
          uStack_588 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_9b0 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_5a0 = *(undefined8 *)*local_9b0;
          uStack_598 = *(undefined8 *)(*local_9b0 + 8);
          auVar118 = vpmovzxbw_avx2(*local_9b0);
          local_9b8 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 * 2));
          local_5b0 = *(undefined8 *)*local_9b8;
          uStack_5a8 = *(undefined8 *)(*local_9b8 + 8);
          auVar1 = vpmovzxbw_avx2(*local_9b8);
          local_9c0 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 * 3));
          local_5c0 = *(undefined8 *)*local_9c0;
          uStack_5b8 = *(undefined8 *)(*local_9c0 + 8);
          auVar2 = vpmovzxbw_avx2(*local_9c0);
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2300 = local_3540;
          uStack_22f8 = uStack_3538;
          uStack_22f0 = uStack_3530;
          uStack_22e8 = uStack_3528;
          local_2304 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2340 = local_3560;
          uStack_2338 = uStack_3558;
          uStack_2330 = uStack_3550;
          uStack_2328 = uStack_3548;
          local_2344 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2380 = local_3580;
          uStack_2378 = uStack_3578;
          uStack_2370 = uStack_3570;
          uStack_2368 = uStack_3568;
          local_2384 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_23c0 = local_35a0;
          uStack_23b8 = uStack_3598;
          uStack_23b0 = uStack_3590;
          uStack_23a8 = uStack_3588;
          local_23c4 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3540 = auVar117._0_8_;
          uStack_3538 = auVar117._8_8_;
          uStack_3530 = auVar117._16_8_;
          uStack_3528 = auVar117._24_8_;
          local_2e80 = local_3540;
          uStack_2e78 = uStack_3538;
          uStack_2e70 = uStack_3530;
          uStack_2e68 = uStack_3528;
          local_2ea0 = local_3100;
          lStack_2e98 = lStack_30f8;
          lStack_2e90 = lStack_30f0;
          lStack_2e88 = lStack_30e8;
          auVar8._8_8_ = lStack_30f8;
          auVar8._0_8_ = local_3100;
          auVar8._16_8_ = lStack_30f0;
          auVar8._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar8);
          local_3560 = auVar118._0_8_;
          uStack_3558 = auVar118._8_8_;
          uStack_3550 = auVar118._16_8_;
          uStack_3548 = auVar118._24_8_;
          local_2ec0 = local_3560;
          uStack_2eb8 = uStack_3558;
          uStack_2eb0 = uStack_3550;
          uStack_2ea8 = uStack_3548;
          local_2ee0 = local_3100;
          lStack_2ed8 = lStack_30f8;
          lStack_2ed0 = lStack_30f0;
          lStack_2ec8 = lStack_30e8;
          auVar7._8_8_ = lStack_30f8;
          auVar7._0_8_ = local_3100;
          auVar7._16_8_ = lStack_30f0;
          auVar7._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar7);
          local_3580 = auVar1._0_8_;
          uStack_3578 = auVar1._8_8_;
          uStack_3570 = auVar1._16_8_;
          uStack_3568 = auVar1._24_8_;
          local_2f00 = local_3580;
          uStack_2ef8 = uStack_3578;
          uStack_2ef0 = uStack_3570;
          uStack_2ee8 = uStack_3568;
          local_2f20 = local_3100;
          lStack_2f18 = lStack_30f8;
          lStack_2f10 = lStack_30f0;
          lStack_2f08 = lStack_30e8;
          auVar6._8_8_ = lStack_30f8;
          auVar6._0_8_ = local_3100;
          auVar6._16_8_ = lStack_30f0;
          auVar6._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar6);
          local_35a0 = auVar2._0_8_;
          uStack_3598 = auVar2._8_8_;
          uStack_3590 = auVar2._16_8_;
          uStack_3588 = auVar2._24_8_;
          local_2f40 = local_35a0;
          uStack_2f38 = uStack_3598;
          uStack_2f30 = uStack_3590;
          uStack_2f28 = uStack_3588;
          local_2f60 = local_3100;
          lStack_2f58 = lStack_30f8;
          lStack_2f50 = lStack_30f0;
          lStack_2f48 = lStack_30e8;
          auVar5._8_8_ = lStack_30f8;
          auVar5._0_8_ = local_3100;
          auVar5._16_8_ = lStack_30f0;
          auVar5._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar5);
          local_6e8 = local_3058;
          local_6f0 = (long)*local_3058 + (long)(int)local_305c * 2;
          local_6f8 = (long)*local_3058 + (long)(int)(local_305c * 2) * 2;
          local_700 = (undefined8 *)((long)*local_3058 + (long)(int)(local_305c * 3) * 2);
          uVar111 = *local_700;
          uVar124 = local_700[1];
          uVar133 = local_700[2];
          uVar142 = local_700[3];
          palVar104 = (__m256i *)local_30a0;
          uVar153 = 0;
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          res_unsigned = (__m256i *)&local_3100;
          convolve_rounding(res_unsigned,(__m256i *)CONCAT44(uVar153,in_stack_ffffffffffffc5c8),
                            palVar104,iVar152);
          uVar112 = uVar111;
          uVar125 = uVar124;
          uVar134 = uVar133;
          uVar143 = uVar142;
          convolve_rounding(res_unsigned,(__m256i *)CONCAT44(uVar153,in_stack_ffffffffffffc5c8),
                            palVar104,iVar152);
          uVar113 = uVar112;
          uVar126 = uVar125;
          uVar135 = uVar134;
          uVar144 = uVar143;
          convolve_rounding(res_unsigned,(__m256i *)CONCAT44(uVar153,in_stack_ffffffffffffc5c8),
                            palVar104,iVar152);
          uVar114 = uVar113;
          uVar127 = uVar126;
          uVar136 = uVar135;
          uVar145 = uVar144;
          convolve_rounding(res_unsigned,(__m256i *)CONCAT44(uVar153,in_stack_ffffffffffffc5c8),
                            palVar104,iVar152);
          auVar51._8_8_ = uVar124;
          auVar51._0_8_ = uVar111;
          auVar51._16_8_ = uVar133;
          auVar51._24_8_ = uVar142;
          auVar50._8_8_ = uVar125;
          auVar50._0_8_ = uVar112;
          auVar50._16_8_ = uVar134;
          auVar50._24_8_ = uVar143;
          auVar117 = vpackuswb_avx2(auVar51,auVar50);
          auVar49._8_8_ = uVar126;
          auVar49._0_8_ = uVar113;
          auVar49._16_8_ = uVar135;
          auVar49._24_8_ = uVar144;
          auVar48._8_8_ = uVar127;
          auVar48._0_8_ = uVar114;
          auVar48._16_8_ = uVar136;
          auVar48._24_8_ = uVar145;
          auVar118 = vpackuswb_avx2(auVar49,auVar48);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_ea8 = local_3040;
          local_36c0 = auVar117._0_8_;
          local_12c0 = local_36c0;
          uStack_36b8 = auVar117._8_8_;
          uStack_12b8 = uStack_36b8;
          uStack_36b0 = auVar117._16_8_;
          uStack_12b0 = uStack_36b0;
          puStack_36a8 = auVar117._24_8_;
          puStack_12a8 = puStack_36a8;
          local_ec0 = local_36c0;
          uStack_eb8 = uStack_36b8;
          *local_3040 = local_36c0;
          local_3040[1] = uStack_36b8;
          local_ec8 = puStack_36a8;
          uStack_ed0 = uStack_36b0;
          *puStack_36a8 = local_ee0;
          puStack_36a8[1] = uStack_ed8;
          local_ee8 = (undefined8 *)((long)local_3040 + (long)(local_3044 * 2));
          local_36e0 = auVar118._0_8_;
          local_12e0 = local_36e0;
          uStack_36d8 = auVar118._8_8_;
          uStack_12d8 = uStack_36d8;
          uStack_36d0 = auVar118._16_8_;
          uStack_12d0 = uStack_36d0;
          uStack_36c8 = auVar118._24_8_;
          uStack_12c8 = uStack_36c8;
          local_f00 = local_36e0;
          uStack_ef8 = uStack_36d8;
          *local_ee8 = local_36e0;
          local_ee8[1] = uStack_36d8;
          local_f08 = (undefined8 *)((long)local_3040 + (long)(local_3044 * 3));
          local_f20 = uStack_36d0;
          uStack_f18 = uStack_36c8;
          *local_f08 = uStack_36d0;
          local_f08[1] = uStack_36c8;
          local_3504 = local_3504 + -4;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 2));
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 2) * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 2));
          local_18a0 = uVar114;
          uStack_1898 = uVar127;
          uStack_1890 = uVar136;
          uStack_1888 = uVar145;
          local_1880 = uVar113;
          uStack_1878 = uVar126;
          uStack_1870 = uVar135;
          uStack_1868 = uVar144;
          local_1860 = uVar112;
          uStack_1858 = uVar125;
          uStack_1850 = uVar134;
          uStack_1848 = uVar143;
          local_1840 = uVar111;
          uStack_1838 = uVar124;
          uStack_1830 = uVar133;
          uStack_1828 = uVar142;
        } while (local_3504 != 0);
      }
    }
    else {
      local_3144 = local_304c;
      if (local_3048 < 0x10) {
        if (local_3048 == 8) {
          do {
            local_248 = local_3030;
            local_9d0 = *(ulong *)*local_3030;
            uStack_258 = 0;
            local_268 = (undefined8 *)(*local_3030 + (int)local_3034);
            uStack_710 = *local_268;
            uStack_278 = 0;
            local_288 = (ulong *)(*local_3030 + (int)(local_3034 * 2));
            local_9e0 = *local_288;
            uStack_298 = 0;
            local_2a8 = (undefined8 *)(*local_3030 + (int)(local_3034 * 3));
            uStack_750 = *local_2a8;
            uStack_2b8 = 0;
            uStack_9c8 = 0;
            uStack_9d8 = 0;
            uStack_718 = 0;
            uStack_708 = 0;
            local_740 = local_30c0;
            uStack_738 = uStack_30b8;
            uStack_730 = uStack_30b0;
            uStack_728 = uStack_30a8;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = local_9d0;
            auVar100._16_8_ = uStack_710;
            auVar100._24_8_ = 0;
            auVar99._8_8_ = uStack_30b8;
            auVar99._0_8_ = local_30c0;
            auVar99._16_8_ = uStack_30b0;
            auVar99._24_8_ = uStack_30a8;
            auVar117 = vpunpcklbw_avx2(auVar100,auVar99);
            uStack_758 = 0;
            uStack_748 = 0;
            local_780 = local_30c0;
            uStack_778 = uStack_30b8;
            uStack_770 = uStack_30b0;
            uStack_768 = uStack_30a8;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = local_9e0;
            auVar98._16_8_ = uStack_750;
            auVar98._24_8_ = 0;
            auVar97._8_8_ = uStack_30b8;
            auVar97._0_8_ = local_30c0;
            auVar97._16_8_ = uStack_30b0;
            auVar97._24_8_ = uStack_30a8;
            auVar118 = vpunpcklbw_avx2(auVar98,auVar97);
            local_3380 = auVar117._0_8_;
            uStack_3378 = auVar117._8_8_;
            uStack_3370 = auVar117._16_8_;
            uStack_3368 = auVar117._24_8_;
            local_1e40 = local_3380;
            uStack_1e38 = uStack_3378;
            uStack_1e30 = uStack_3370;
            uStack_1e28 = uStack_3368;
            local_1e44 = 4;
            auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
            local_33a0 = auVar118._0_8_;
            uStack_3398 = auVar118._8_8_;
            uStack_3390 = auVar118._16_8_;
            uStack_3388 = auVar118._24_8_;
            local_1e80 = local_33a0;
            uStack_1e78 = uStack_3398;
            uStack_1e70 = uStack_3390;
            uStack_1e68 = uStack_3388;
            local_1e84 = 4;
            auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
            local_3380 = auVar117._0_8_;
            uStack_3378 = auVar117._8_8_;
            uStack_3370 = auVar117._16_8_;
            uStack_3368 = auVar117._24_8_;
            local_29c0 = local_3380;
            uStack_29b8 = uStack_3378;
            uStack_29b0 = uStack_3370;
            uStack_29a8 = uStack_3368;
            local_29e0 = local_3100;
            lStack_29d8 = lStack_30f8;
            lStack_29d0 = lStack_30f0;
            lStack_29c8 = lStack_30e8;
            auVar27._8_8_ = lStack_30f8;
            auVar27._0_8_ = local_3100;
            auVar27._16_8_ = lStack_30f0;
            auVar27._24_8_ = lStack_30e8;
            vpaddw_avx2(auVar117,auVar27);
            local_33a0 = auVar118._0_8_;
            uStack_3398 = auVar118._8_8_;
            uStack_3390 = auVar118._16_8_;
            uStack_3388 = auVar118._24_8_;
            local_2a00 = local_33a0;
            uStack_29f8 = uStack_3398;
            uStack_29f0 = uStack_3390;
            uStack_29e8 = uStack_3388;
            local_2a20 = local_3100;
            lStack_2a18 = lStack_30f8;
            lStack_2a10 = lStack_30f0;
            lStack_2a08 = lStack_30e8;
            auVar26._8_8_ = lStack_30f8;
            auVar26._0_8_ = local_3100;
            auVar26._16_8_ = lStack_30f0;
            auVar26._24_8_ = lStack_30e8;
            auVar117 = vpaddw_avx2(auVar118,auVar26);
            local_760 = local_9e0;
            local_720 = local_9d0;
            local_2c0 = uStack_750;
            local_2a0 = local_9e0;
            local_280 = uStack_710;
            local_260 = local_9d0;
            load_line2_avx2(local_3058,(void *)((long)*local_3058 + (long)(int)local_305c * 2),
                            (void *)(ulong)local_3034);
            load_line2_avx2((__m256i *)((long)*local_3058 + (long)(int)(local_305c * 2) * 2),
                            (void *)((long)*local_3058 + (long)(int)(local_305c * 3) * 2),
                            (void *)(ulong)local_305c);
            iVar154 = 1;
            comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,1
                    );
            comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                     iVar154);
            palVar104 = (__m256i *)&local_3100;
            in_stack_ffffffffffffc688 = (__m256i *)local_3140;
            convolve_rounding(in_stack_ffffffffffffc5d0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8),
                              in_stack_ffffffffffffc5c0,iVar152);
            auVar118 = auVar117;
            in_stack_ffffffffffffc680 = palVar104;
            convolve_rounding(in_stack_ffffffffffffc5d0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8),
                              in_stack_ffffffffffffc5c0,iVar152);
            local_3400 = auVar117._0_8_;
            uStack_33f8 = auVar117._8_8_;
            uStack_33f0 = auVar117._16_8_;
            uStack_33e8 = auVar117._24_8_;
            local_3420 = auVar118._0_8_;
            uStack_3418 = auVar118._8_8_;
            uStack_3410 = auVar118._16_8_;
            uStack_3408 = auVar118._24_8_;
            local_15c0 = local_3400;
            uStack_15b8 = uStack_33f8;
            uStack_15b0 = uStack_33f0;
            uStack_15a8 = uStack_33e8;
            local_15e0 = local_3420;
            uStack_15d8 = uStack_3418;
            uStack_15d0 = uStack_3410;
            uStack_15c8 = uStack_3408;
            auVar117 = vpackuswb_avx2(auVar117,auVar118);
            local_3440 = auVar117._0_8_;
            uStack_3438 = auVar117._8_8_;
            uStack_3430 = auVar117._16_8_;
            uStack_3428 = auVar117._24_8_;
            local_1180 = local_3440;
            uStack_1178 = uStack_3438;
            uStack_1170 = uStack_3430;
            uStack_1168 = uStack_3428;
            uStack_fb8 = uStack_3428;
            local_fc0 = uStack_3430;
            local_fa8 = local_3040;
            *local_3040 = uStack_3430;
            local_fc8 = (undefined8 *)((long)local_3040 + (long)local_3044);
            *local_fc8 = local_3460;
            s[1] = extraout_RDX;
            s[0] = (longlong)palVar104;
            _mm_storeh_epi64((__m128i *)((long)local_3040 + (long)(local_3044 << 1)),s);
            s_00[1] = extraout_RDX_00;
            s_00[0] = (longlong)palVar104;
            _mm_storeh_epi64((__m128i *)((long)local_3040 + (long)(local_3044 * 3)),s_00);
            local_3144 = local_3144 + -4;
            local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 2));
            local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 2) * 2);
            local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 2));
          } while (local_3144 != 0);
        }
        else {
          do {
            uVar101 = loadu_int32(local_3030);
            iVar102 = loadu_int32(*local_3030 + (int)local_3034);
            uVar103 = loadu_int32(*local_3030 + (int)(local_3034 * 2));
            local_218 = loadu_int32(*local_3030 + (int)(local_3034 * 3));
            local_20c = 0;
            local_210 = 0;
            local_21c = 0;
            local_220 = 0;
            local_104 = 0;
            local_108 = 0;
            local_114 = 0;
            local_118 = 0;
            auVar116 = vpinsrd_avx(ZEXT416(uVar101),iVar102,1);
            auVar116 = vpinsrd_avx(auVar116,0,2);
            local_140 = vpinsrd_avx(auVar116,0,3);
            auVar116 = vpinsrd_avx(ZEXT416(uVar103),local_218,1);
            auVar116 = vpinsrd_avx(auVar116,0,2);
            auStack_130 = vpinsrd_avx(auVar116,0,3);
            local_7a0 = local_140._0_8_;
            uStack_798 = local_140._8_8_;
            uStack_790 = auStack_130._0_8_;
            uStack_788 = auStack_130._8_8_;
            local_7c0 = local_30c0;
            uStack_7b8 = uStack_30b8;
            uStack_7b0 = uStack_30b0;
            uStack_7a8 = uStack_30a8;
            auVar96._16_8_ = auStack_130._0_8_;
            auVar96._0_16_ = local_140;
            auVar96._24_8_ = auStack_130._8_8_;
            auVar95._8_8_ = uStack_30b8;
            auVar95._0_8_ = local_30c0;
            auVar95._16_8_ = uStack_30b0;
            auVar95._24_8_ = uStack_30a8;
            auVar117 = vpunpcklbw_avx2(auVar96,auVar95);
            local_34a0 = auVar117._0_8_;
            uStack_3498 = auVar117._8_8_;
            uStack_3490 = auVar117._16_8_;
            uStack_3488 = auVar117._24_8_;
            local_1ec0 = local_34a0;
            uStack_1eb8 = uStack_3498;
            uStack_1eb0 = uStack_3490;
            uStack_1ea8 = uStack_3488;
            local_1ec4 = 4;
            auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
            local_34a0 = auVar117._0_8_;
            uStack_3498 = auVar117._8_8_;
            uStack_3490 = auVar117._16_8_;
            uStack_3488 = auVar117._24_8_;
            local_2a40 = local_34a0;
            uStack_2a38 = uStack_3498;
            uStack_2a30 = uStack_3490;
            uStack_2a28 = uStack_3488;
            local_2a60 = local_3100;
            lStack_2a58 = lStack_30f8;
            lStack_2a50 = lStack_30f0;
            lStack_2a48 = lStack_30e8;
            auVar25._8_8_ = lStack_30f8;
            auVar25._0_8_ = local_3100;
            auVar25._16_8_ = lStack_30f0;
            auVar25._24_8_ = lStack_30e8;
            vpaddw_avx2(auVar117,auVar25);
            local_1c8 = (*local_3058)[0];
            local_1d0 = *(ulong *)((long)*local_3058 + (long)(int)local_305c * 2);
            local_1d8 = *(ulong *)((long)*local_3058 + (long)(int)(local_305c * 2) * 2);
            local_1e0 = *(ulong *)((long)*local_3058 + (long)(int)(local_305c * 3) * 2);
            auVar115._8_8_ = 0;
            auVar115._0_8_ = local_1c8;
            auVar146._8_8_ = 0;
            auVar146._0_8_ = local_1d0;
            local_c0 = vpunpcklqdq_avx(auVar115,auVar146);
            auVar147._8_8_ = 0;
            auVar147._0_8_ = local_1d8;
            auVar150._8_8_ = 0;
            auVar150._0_8_ = local_1e0;
            auStack_b0 = vpunpcklqdq_avx(auVar147,auVar150);
            uVar111 = local_c0._0_8_;
            uVar124 = local_c0._8_8_;
            uVar133 = auStack_b0._0_8_;
            uVar142 = auStack_b0._8_8_;
            local_214 = uVar103;
            local_208 = iVar102;
            local_204 = uVar101;
            local_120 = uVar101;
            local_11c = iVar102;
            local_110 = uVar103;
            local_10c = local_218;
            local_a0 = local_1c8;
            local_98 = local_1d0;
            local_90 = local_1d8;
            local_88 = local_1e0;
            comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                     in_stack_ffffffffffffc67c);
            convolve_rounding(in_stack_ffffffffffffc5d0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8),
                              in_stack_ffffffffffffc5c0,iVar152);
            local_34e0._8_8_ = uVar124;
            local_34e0._0_8_ = uVar111;
            auVar69._16_8_ = uVar133;
            auVar69._0_16_ = local_34e0;
            auVar69._24_8_ = uVar142;
            auVar68._16_8_ = uVar133;
            auVar68._0_16_ = local_34e0;
            auVar68._24_8_ = uVar142;
            auVar117 = vpackuswb_avx2(auVar69,auVar68);
            local_34e0._0_8_ = auVar117._0_8_;
            local_11a0 = local_34e0._0_8_;
            local_34e0._8_8_ = auVar117._8_8_;
            uStack_1198 = local_34e0._8_8_;
            uStack_34d0 = auVar117._16_8_;
            uStack_1190 = uStack_34d0;
            uStack_34c8 = auVar117._24_8_;
            uStack_1188 = uStack_34c8;
            uStack_f38 = uStack_34c8;
            local_f30 = uStack_34d0;
            local_f40._0_4_ = auVar117._16_4_;
            *(undefined4 *)local_3040 = (undefined4)local_f40;
            *(undefined4 *)((long)local_3040 + (long)(local_3044 * 2)) = local_3500;
            uStack_34ec = auVar117._20_4_;
            *(undefined4 *)((long)local_3040 + (long)local_3044) = uStack_34ec;
            *(undefined4 *)((long)local_3040 + (long)(local_3044 * 3)) = uStack_34fc;
            local_3144 = local_3144 + -4;
            local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 2));
            local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 2) * 2);
            local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 2));
            local_1620 = uVar111;
            uStack_1618 = uVar124;
            uStack_1610 = uVar133;
            uStack_1608 = uVar142;
            local_1600 = uVar111;
            uStack_15f8 = uVar124;
            uStack_15f0 = uVar133;
            uStack_15e8 = uVar142;
            local_f40 = local_f30;
            uStack_f28 = uStack_f38;
          } while (local_3144 != 0);
        }
      }
      else if (local_3048 == 0x80) {
        do {
          local_888 = local_3030;
          local_350 = *(undefined8 *)*local_3030;
          uStack_348 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_890 = local_3030 + 1;
          local_360 = *(undefined8 *)*local_890;
          uStack_358 = *(undefined8 *)(local_3030[1] + 8);
          auVar118 = vpmovzxbw_avx2(*local_890);
          local_898 = local_3030 + 2;
          local_370 = *(undefined8 *)*local_898;
          uStack_368 = *(undefined8 *)(local_3030[2] + 8);
          auVar1 = vpmovzxbw_avx2(*local_898);
          local_8a0 = local_3030 + 3;
          local_380 = *(undefined8 *)*local_8a0;
          uStack_378 = *(undefined8 *)(local_3030[3] + 8);
          auVar2 = vpmovzxbw_avx2(*local_8a0);
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_1940 = local_3180;
          uStack_1938 = uStack_3178;
          uStack_1930 = uStack_3170;
          uStack_1928 = uStack_3168;
          local_1944 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_1980 = local_31a0;
          uStack_1978 = uStack_3198;
          uStack_1970 = uStack_3190;
          uStack_1968 = uStack_3188;
          local_1984 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_19c0 = local_31c0;
          uStack_19b8 = uStack_31b8;
          uStack_19b0 = uStack_31b0;
          uStack_19a8 = uStack_31a8;
          local_19c4 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_1a00 = local_31e0;
          uStack_19f8 = uStack_31d8;
          uStack_19f0 = uStack_31d0;
          uStack_19e8 = uStack_31c8;
          local_1a04 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_24c0 = local_3180;
          uStack_24b8 = uStack_3178;
          uStack_24b0 = uStack_3170;
          uStack_24a8 = uStack_3168;
          local_24e0 = local_3100;
          lStack_24d8 = lStack_30f8;
          lStack_24d0 = lStack_30f0;
          lStack_24c8 = lStack_30e8;
          auVar47._8_8_ = lStack_30f8;
          auVar47._0_8_ = local_3100;
          auVar47._16_8_ = lStack_30f0;
          auVar47._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar47);
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_2500 = local_31a0;
          uStack_24f8 = uStack_3198;
          uStack_24f0 = uStack_3190;
          uStack_24e8 = uStack_3188;
          local_2520 = local_3100;
          lStack_2518 = lStack_30f8;
          lStack_2510 = lStack_30f0;
          lStack_2508 = lStack_30e8;
          auVar46._8_8_ = lStack_30f8;
          auVar46._0_8_ = local_3100;
          auVar46._16_8_ = lStack_30f0;
          auVar46._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar46);
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_2540 = local_31c0;
          uStack_2538 = uStack_31b8;
          uStack_2530 = uStack_31b0;
          uStack_2528 = uStack_31a8;
          local_2560 = local_3100;
          lStack_2558 = lStack_30f8;
          lStack_2550 = lStack_30f0;
          lStack_2548 = lStack_30e8;
          auVar45._8_8_ = lStack_30f8;
          auVar45._0_8_ = local_3100;
          auVar45._16_8_ = lStack_30f0;
          auVar45._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar45);
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_2580 = local_31e0;
          uStack_2578 = uStack_31d8;
          uStack_2570 = uStack_31d0;
          uStack_2568 = uStack_31c8;
          local_25a0 = local_3100;
          lStack_2598 = lStack_30f8;
          lStack_2590 = lStack_30f0;
          lStack_2588 = lStack_30e8;
          auVar44._8_8_ = lStack_30f8;
          auVar44._0_8_ = local_3100;
          auVar44._16_8_ = lStack_30f0;
          auVar44._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar44);
          local_5c8 = local_3058;
          local_5d0 = local_3058 + 1;
          local_5d8 = local_3058 + 2;
          local_5e0 = local_3058 + 3;
          lVar106 = (*local_5e0)[0];
          lVar119 = local_3058[3][1];
          lVar128 = local_3058[3][2];
          lVar137 = local_3058[3][3];
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar107 = lVar106;
          lVar120 = lVar119;
          lVar129 = lVar128;
          lVar138 = lVar137;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar108 = lVar107;
          lVar121 = lVar120;
          lVar130 = lVar129;
          lVar139 = lVar138;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar109 = lVar108;
          lVar122 = lVar121;
          lVar131 = lVar130;
          lVar140 = lVar139;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar89._8_8_ = lVar119;
          auVar89._0_8_ = lVar106;
          auVar89._16_8_ = lVar128;
          auVar89._24_8_ = lVar137;
          auVar88._8_8_ = lVar120;
          auVar88._0_8_ = lVar107;
          auVar88._16_8_ = lVar129;
          auVar88._24_8_ = lVar138;
          auVar117 = vpackuswb_avx2(auVar89,auVar88);
          auVar87._8_8_ = lVar121;
          auVar87._0_8_ = lVar108;
          auVar87._16_8_ = lVar130;
          auVar87._24_8_ = lVar139;
          auVar86._8_8_ = lVar122;
          auVar86._0_8_ = lVar109;
          auVar86._16_8_ = lVar131;
          auVar86._24_8_ = lVar140;
          auVar118 = vpackuswb_avx2(auVar87,auVar86);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_3300 = auVar117._0_8_;
          uStack_32f8 = auVar117._8_8_;
          uStack_32f0 = auVar117._16_8_;
          puStack_32e8 = auVar117._24_8_;
          local_1040 = local_3300;
          uStack_1038 = uStack_32f8;
          uStack_1030 = uStack_32f0;
          puStack_1028 = puStack_32e8;
          local_a28 = local_3040;
          local_a40 = local_3300;
          uStack_a38 = uStack_32f8;
          *local_3040 = local_3300;
          local_3040[1] = uStack_32f8;
          local_a48 = puStack_32e8;
          uStack_a50 = uStack_32f0;
          *puStack_32e8 = local_a60;
          puStack_32e8[1] = uStack_a58;
          local_a68 = local_3040 + 4;
          local_3320 = auVar118._0_8_;
          uStack_3318 = auVar118._8_8_;
          uStack_3310 = auVar118._16_8_;
          uStack_3308 = auVar118._24_8_;
          local_1060 = local_3320;
          uStack_1058 = uStack_3318;
          uStack_1050 = uStack_3310;
          uStack_1048 = uStack_3308;
          local_a80 = local_3320;
          uStack_a78 = uStack_3318;
          *local_a68 = local_3320;
          local_3040[5] = uStack_3318;
          local_a88 = local_3040 + 6;
          local_aa0 = uStack_3310;
          uStack_a98 = uStack_3308;
          *local_a88 = uStack_3310;
          local_3040[7] = uStack_3308;
          local_8a8 = local_3030 + 4;
          local_390 = *(undefined8 *)*local_8a8;
          uStack_388 = *(undefined8 *)(local_3030[4] + 8);
          auVar117 = vpmovzxbw_avx2(*local_8a8);
          local_8b0 = local_3030 + 5;
          local_3a0 = *(undefined8 *)*local_8b0;
          uStack_398 = *(undefined8 *)(local_3030[5] + 8);
          auVar118 = vpmovzxbw_avx2(*local_8b0);
          local_8b8 = local_3030 + 6;
          local_3b0 = *(undefined8 *)*local_8b8;
          uStack_3a8 = *(undefined8 *)(local_3030[6] + 8);
          auVar1 = vpmovzxbw_avx2(*local_8b8);
          local_8c0 = local_3030 + 7;
          local_3c0 = *(undefined8 *)*local_8c0;
          uStack_3b8 = *(undefined8 *)(local_3030[7] + 8);
          auVar2 = vpmovzxbw_avx2(*local_8c0);
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_1a40 = local_3180;
          uStack_1a38 = uStack_3178;
          uStack_1a30 = uStack_3170;
          uStack_1a28 = uStack_3168;
          local_1a44 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_1a80 = local_31a0;
          uStack_1a78 = uStack_3198;
          uStack_1a70 = uStack_3190;
          uStack_1a68 = uStack_3188;
          local_1a84 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_1ac0 = local_31c0;
          uStack_1ab8 = uStack_31b8;
          uStack_1ab0 = uStack_31b0;
          uStack_1aa8 = uStack_31a8;
          local_1ac4 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_1b00 = local_31e0;
          uStack_1af8 = uStack_31d8;
          uStack_1af0 = uStack_31d0;
          uStack_1ae8 = uStack_31c8;
          local_1b04 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_25c0 = local_3180;
          uStack_25b8 = uStack_3178;
          uStack_25b0 = uStack_3170;
          uStack_25a8 = uStack_3168;
          local_25e0 = local_3100;
          lStack_25d8 = lStack_30f8;
          lStack_25d0 = lStack_30f0;
          lStack_25c8 = lStack_30e8;
          auVar43._8_8_ = lStack_30f8;
          auVar43._0_8_ = local_3100;
          auVar43._16_8_ = lStack_30f0;
          auVar43._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar43);
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_2600 = local_31a0;
          uStack_25f8 = uStack_3198;
          uStack_25f0 = uStack_3190;
          uStack_25e8 = uStack_3188;
          local_2620 = local_3100;
          lStack_2618 = lStack_30f8;
          lStack_2610 = lStack_30f0;
          lStack_2608 = lStack_30e8;
          auVar42._8_8_ = lStack_30f8;
          auVar42._0_8_ = local_3100;
          auVar42._16_8_ = lStack_30f0;
          auVar42._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar42);
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_2640 = local_31c0;
          uStack_2638 = uStack_31b8;
          uStack_2630 = uStack_31b0;
          uStack_2628 = uStack_31a8;
          local_2660 = local_3100;
          lStack_2658 = lStack_30f8;
          lStack_2650 = lStack_30f0;
          lStack_2648 = lStack_30e8;
          auVar41._8_8_ = lStack_30f8;
          auVar41._0_8_ = local_3100;
          auVar41._16_8_ = lStack_30f0;
          auVar41._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar41);
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_2680 = local_31e0;
          uStack_2678 = uStack_31d8;
          uStack_2670 = uStack_31d0;
          uStack_2668 = uStack_31c8;
          local_26a0 = local_3100;
          lStack_2698 = lStack_30f8;
          lStack_2690 = lStack_30f0;
          lStack_2688 = lStack_30e8;
          auVar40._8_8_ = lStack_30f8;
          auVar40._0_8_ = local_3100;
          auVar40._16_8_ = lStack_30f0;
          auVar40._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar40);
          local_5e8 = local_3058 + 4;
          local_5f0 = local_3058 + 5;
          local_5f8 = local_3058 + 6;
          local_600 = local_3058 + 7;
          lVar110 = (*local_600)[0];
          lVar123 = local_3058[7][1];
          lVar132 = local_3058[7][2];
          lVar141 = local_3058[7][3];
          local_13a0 = lVar109;
          lStack_1398 = lVar122;
          lStack_1390 = lVar131;
          lStack_1388 = lVar140;
          local_1380 = lVar108;
          lStack_1378 = lVar121;
          lStack_1370 = lVar130;
          lStack_1368 = lVar139;
          local_1360 = lVar107;
          lStack_1358 = lVar120;
          lStack_1350 = lVar129;
          lStack_1348 = lVar138;
          local_1340 = lVar106;
          lStack_1338 = lVar119;
          lStack_1330 = lVar128;
          lStack_1328 = lVar137;
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar106 = lVar110;
          lVar119 = lVar123;
          lVar128 = lVar132;
          lVar137 = lVar141;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar107 = lVar106;
          lVar120 = lVar119;
          lVar129 = lVar128;
          lVar138 = lVar137;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar108 = lVar107;
          lVar121 = lVar120;
          lVar130 = lVar129;
          lVar139 = lVar138;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar85._8_8_ = lVar123;
          auVar85._0_8_ = lVar110;
          auVar85._16_8_ = lVar132;
          auVar85._24_8_ = lVar141;
          auVar84._8_8_ = lVar119;
          auVar84._0_8_ = lVar106;
          auVar84._16_8_ = lVar128;
          auVar84._24_8_ = lVar137;
          auVar117 = vpackuswb_avx2(auVar85,auVar84);
          auVar83._8_8_ = lVar120;
          auVar83._0_8_ = lVar107;
          auVar83._16_8_ = lVar129;
          auVar83._24_8_ = lVar138;
          auVar82._8_8_ = lVar121;
          auVar82._0_8_ = lVar108;
          auVar82._16_8_ = lVar130;
          auVar82._24_8_ = lVar139;
          auVar118 = vpackuswb_avx2(auVar83,auVar82);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_aa8 = local_3040 + 8;
          local_3300 = auVar117._0_8_;
          local_1080 = local_3300;
          uStack_32f8 = auVar117._8_8_;
          uStack_1078 = uStack_32f8;
          uStack_32f0 = auVar117._16_8_;
          uStack_1070 = uStack_32f0;
          puStack_32e8 = auVar117._24_8_;
          puStack_1068 = puStack_32e8;
          local_ac0 = local_3300;
          uStack_ab8 = uStack_32f8;
          *local_aa8 = local_3300;
          local_3040[9] = uStack_32f8;
          local_ac8 = puStack_32e8;
          uStack_ad0 = uStack_32f0;
          *puStack_32e8 = local_ae0;
          puStack_32e8[1] = uStack_ad8;
          local_ae8 = local_3040 + 0xc;
          local_3320 = auVar118._0_8_;
          local_10a0 = local_3320;
          uStack_3318 = auVar118._8_8_;
          uStack_1098 = uStack_3318;
          uStack_3310 = auVar118._16_8_;
          uStack_1090 = uStack_3310;
          uStack_3308 = auVar118._24_8_;
          uStack_1088 = uStack_3308;
          local_b00 = local_3320;
          uStack_af8 = uStack_3318;
          *local_ae8 = local_3320;
          local_3040[0xd] = uStack_3318;
          local_b08 = local_3040 + 0xe;
          local_b20 = uStack_3310;
          uStack_b18 = uStack_3308;
          *local_b08 = uStack_3310;
          local_3040[0xf] = uStack_3308;
          local_3144 = local_3144 + -1;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)local_305c * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)local_3044);
          local_1420 = lVar108;
          lStack_1418 = lVar121;
          lStack_1410 = lVar130;
          lStack_1408 = lVar139;
          local_1400 = lVar107;
          lStack_13f8 = lVar120;
          lStack_13f0 = lVar129;
          lStack_13e8 = lVar138;
          local_13e0 = lVar106;
          lStack_13d8 = lVar119;
          lStack_13d0 = lVar128;
          lStack_13c8 = lVar137;
          local_13c0 = lVar110;
          lStack_13b8 = lVar123;
          lStack_13b0 = lVar132;
          lStack_13a8 = lVar141;
        } while (local_3144 != 0);
      }
      else if (local_3048 == 0x40) {
        do {
          local_8c8 = local_3030;
          local_3d0 = *(undefined8 *)*local_3030;
          uStack_3c8 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_8d0 = local_3030 + 1;
          local_3e0 = *(undefined8 *)*local_8d0;
          uStack_3d8 = *(undefined8 *)(local_3030[1] + 8);
          auVar118 = vpmovzxbw_avx2(*local_8d0);
          local_8d8 = local_3030 + 2;
          local_3f0 = *(undefined8 *)*local_8d8;
          uStack_3e8 = *(undefined8 *)(local_3030[2] + 8);
          auVar1 = vpmovzxbw_avx2(*local_8d8);
          local_8e0 = local_3030 + 3;
          local_400 = *(undefined8 *)*local_8e0;
          uStack_3f8 = *(undefined8 *)(local_3030[3] + 8);
          auVar2 = vpmovzxbw_avx2(*local_8e0);
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_1b40 = local_3180;
          uStack_1b38 = uStack_3178;
          uStack_1b30 = uStack_3170;
          uStack_1b28 = uStack_3168;
          local_1b44 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_1b80 = local_31a0;
          uStack_1b78 = uStack_3198;
          uStack_1b70 = uStack_3190;
          uStack_1b68 = uStack_3188;
          local_1b84 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_1bc0 = local_31c0;
          uStack_1bb8 = uStack_31b8;
          uStack_1bb0 = uStack_31b0;
          uStack_1ba8 = uStack_31a8;
          local_1bc4 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_1c00 = local_31e0;
          uStack_1bf8 = uStack_31d8;
          uStack_1bf0 = uStack_31d0;
          uStack_1be8 = uStack_31c8;
          local_1c04 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_26c0 = local_3180;
          uStack_26b8 = uStack_3178;
          uStack_26b0 = uStack_3170;
          uStack_26a8 = uStack_3168;
          local_26e0 = local_3100;
          lStack_26d8 = lStack_30f8;
          lStack_26d0 = lStack_30f0;
          lStack_26c8 = lStack_30e8;
          auVar39._8_8_ = lStack_30f8;
          auVar39._0_8_ = local_3100;
          auVar39._16_8_ = lStack_30f0;
          auVar39._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar39);
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_2700 = local_31a0;
          uStack_26f8 = uStack_3198;
          uStack_26f0 = uStack_3190;
          uStack_26e8 = uStack_3188;
          local_2720 = local_3100;
          lStack_2718 = lStack_30f8;
          lStack_2710 = lStack_30f0;
          lStack_2708 = lStack_30e8;
          auVar38._8_8_ = lStack_30f8;
          auVar38._0_8_ = local_3100;
          auVar38._16_8_ = lStack_30f0;
          auVar38._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar38);
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_2740 = local_31c0;
          uStack_2738 = uStack_31b8;
          uStack_2730 = uStack_31b0;
          uStack_2728 = uStack_31a8;
          local_2760 = local_3100;
          lStack_2758 = lStack_30f8;
          lStack_2750 = lStack_30f0;
          lStack_2748 = lStack_30e8;
          auVar37._8_8_ = lStack_30f8;
          auVar37._0_8_ = local_3100;
          auVar37._16_8_ = lStack_30f0;
          auVar37._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar37);
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_2780 = local_31e0;
          uStack_2778 = uStack_31d8;
          uStack_2770 = uStack_31d0;
          uStack_2768 = uStack_31c8;
          local_27a0 = local_3100;
          lStack_2798 = lStack_30f8;
          lStack_2790 = lStack_30f0;
          lStack_2788 = lStack_30e8;
          auVar36._8_8_ = lStack_30f8;
          auVar36._0_8_ = local_3100;
          auVar36._16_8_ = lStack_30f0;
          auVar36._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar36);
          local_608 = local_3058;
          local_610 = local_3058 + 1;
          local_618 = local_3058 + 2;
          local_620 = local_3058 + 3;
          lVar106 = (*local_620)[0];
          lVar119 = local_3058[3][1];
          lVar128 = local_3058[3][2];
          lVar137 = local_3058[3][3];
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar110 = lVar106;
          lVar123 = lVar119;
          lVar132 = lVar128;
          lVar141 = lVar137;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar107 = lVar110;
          lVar120 = lVar123;
          lVar129 = lVar132;
          lVar138 = lVar141;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          lVar108 = lVar107;
          lVar121 = lVar120;
          lVar130 = lVar129;
          lVar139 = lVar138;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar81._8_8_ = lVar119;
          auVar81._0_8_ = lVar106;
          auVar81._16_8_ = lVar128;
          auVar81._24_8_ = lVar137;
          auVar80._8_8_ = lVar123;
          auVar80._0_8_ = lVar110;
          auVar80._16_8_ = lVar132;
          auVar80._24_8_ = lVar141;
          auVar117 = vpackuswb_avx2(auVar81,auVar80);
          auVar79._8_8_ = lVar120;
          auVar79._0_8_ = lVar107;
          auVar79._16_8_ = lVar129;
          auVar79._24_8_ = lVar138;
          auVar78._8_8_ = lVar121;
          auVar78._0_8_ = lVar108;
          auVar78._16_8_ = lVar130;
          auVar78._24_8_ = lVar139;
          auVar118 = vpackuswb_avx2(auVar79,auVar78);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_b28 = local_3040;
          local_3300 = auVar117._0_8_;
          local_10c0 = local_3300;
          uStack_32f8 = auVar117._8_8_;
          uStack_10b8 = uStack_32f8;
          uStack_32f0 = auVar117._16_8_;
          uStack_10b0 = uStack_32f0;
          puStack_32e8 = auVar117._24_8_;
          puStack_10a8 = puStack_32e8;
          local_b40 = local_3300;
          uStack_b38 = uStack_32f8;
          *local_3040 = local_3300;
          local_3040[1] = uStack_32f8;
          local_b48 = puStack_32e8;
          uStack_b50 = uStack_32f0;
          *puStack_32e8 = local_b60;
          puStack_32e8[1] = uStack_b58;
          local_b68 = local_3040 + 4;
          local_3320 = auVar118._0_8_;
          local_10e0 = local_3320;
          uStack_3318 = auVar118._8_8_;
          uStack_10d8 = uStack_3318;
          uStack_3310 = auVar118._16_8_;
          uStack_10d0 = uStack_3310;
          uStack_3308 = auVar118._24_8_;
          uStack_10c8 = uStack_3308;
          local_b80 = local_3320;
          uStack_b78 = uStack_3318;
          *local_b68 = local_3320;
          local_3040[5] = uStack_3318;
          local_b88 = local_3040 + 6;
          local_ba0 = uStack_3310;
          uStack_b98 = uStack_3308;
          *local_b88 = uStack_3310;
          local_3040[7] = uStack_3308;
          local_3144 = local_3144 + -1;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)local_305c * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)local_3044);
          local_14a0 = lVar108;
          lStack_1498 = lVar121;
          lStack_1490 = lVar130;
          lStack_1488 = lVar139;
          local_1480 = lVar107;
          lStack_1478 = lVar120;
          lStack_1470 = lVar129;
          lStack_1468 = lVar138;
          local_1460 = lVar110;
          lStack_1458 = lVar123;
          lStack_1450 = lVar132;
          lStack_1448 = lVar141;
          local_1440 = lVar106;
          lStack_1438 = lVar119;
          lStack_1430 = lVar128;
          lStack_1428 = lVar137;
        } while (local_3144 != 0);
      }
      else if (local_3048 == 0x20) {
        do {
          local_8e8 = local_3030;
          local_410 = *(undefined8 *)*local_3030;
          uStack_408 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_8f0 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_420 = *(undefined8 *)*local_8f0;
          uStack_418 = *(undefined8 *)(*local_8f0 + 8);
          auVar118 = vpmovzxbw_avx2(*local_8f0);
          local_8f8 = local_3030 + 1;
          local_430 = *(undefined8 *)*local_8f8;
          uStack_428 = *(undefined8 *)(local_3030[1] + 8);
          auVar1 = vpmovzxbw_avx2(*local_8f8);
          local_900 = (undefined1 (*) [16])(local_3030[1] + (int)local_3034);
          local_440 = *(undefined8 *)*local_900;
          uStack_438 = *(undefined8 *)(*local_900 + 8);
          auVar2 = vpmovzxbw_avx2(*local_900);
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_1c40 = local_3180;
          uStack_1c38 = uStack_3178;
          uStack_1c30 = uStack_3170;
          uStack_1c28 = uStack_3168;
          local_1c44 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_1c80 = local_31a0;
          uStack_1c78 = uStack_3198;
          uStack_1c70 = uStack_3190;
          uStack_1c68 = uStack_3188;
          local_1c84 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_1cc0 = local_31c0;
          uStack_1cb8 = uStack_31b8;
          uStack_1cb0 = uStack_31b0;
          uStack_1ca8 = uStack_31a8;
          local_1cc4 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_1d00 = local_31e0;
          uStack_1cf8 = uStack_31d8;
          uStack_1cf0 = uStack_31d0;
          uStack_1ce8 = uStack_31c8;
          local_1d04 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_27c0 = local_3180;
          uStack_27b8 = uStack_3178;
          uStack_27b0 = uStack_3170;
          uStack_27a8 = uStack_3168;
          local_27e0 = local_3100;
          lStack_27d8 = lStack_30f8;
          lStack_27d0 = lStack_30f0;
          lStack_27c8 = lStack_30e8;
          auVar35._8_8_ = lStack_30f8;
          auVar35._0_8_ = local_3100;
          auVar35._16_8_ = lStack_30f0;
          auVar35._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar35);
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_2800 = local_31a0;
          uStack_27f8 = uStack_3198;
          uStack_27f0 = uStack_3190;
          uStack_27e8 = uStack_3188;
          local_2820 = local_3100;
          lStack_2818 = lStack_30f8;
          lStack_2810 = lStack_30f0;
          lStack_2808 = lStack_30e8;
          auVar34._8_8_ = lStack_30f8;
          auVar34._0_8_ = local_3100;
          auVar34._16_8_ = lStack_30f0;
          auVar34._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar34);
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_2840 = local_31c0;
          uStack_2838 = uStack_31b8;
          uStack_2830 = uStack_31b0;
          uStack_2828 = uStack_31a8;
          local_2860 = local_3100;
          lStack_2858 = lStack_30f8;
          lStack_2850 = lStack_30f0;
          lStack_2848 = lStack_30e8;
          auVar33._8_8_ = lStack_30f8;
          auVar33._0_8_ = local_3100;
          auVar33._16_8_ = lStack_30f0;
          auVar33._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar33);
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_2880 = local_31e0;
          uStack_2878 = uStack_31d8;
          uStack_2870 = uStack_31d0;
          uStack_2868 = uStack_31c8;
          local_28a0 = local_3100;
          lStack_2898 = lStack_30f8;
          lStack_2890 = lStack_30f0;
          lStack_2888 = lStack_30e8;
          auVar32._8_8_ = lStack_30f8;
          auVar32._0_8_ = local_3100;
          auVar32._16_8_ = lStack_30f0;
          auVar32._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar32);
          local_628 = local_3058;
          local_630 = (long)*local_3058 + (long)(int)local_305c * 2;
          local_638 = local_3058 + 1;
          local_640 = (undefined8 *)((long)local_3058[1] + (long)(int)local_305c * 2);
          uVar111 = *local_640;
          uVar124 = local_640[1];
          uVar133 = local_640[2];
          uVar142 = local_640[3];
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(in_stack_ffffffffffffc690,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar112 = uVar111;
          uVar125 = uVar124;
          uVar134 = uVar133;
          uVar143 = uVar142;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar113 = uVar112;
          uVar126 = uVar125;
          uVar135 = uVar134;
          uVar144 = uVar143;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar114 = uVar113;
          uVar127 = uVar126;
          uVar136 = uVar135;
          uVar145 = uVar144;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar77._8_8_ = uVar124;
          auVar77._0_8_ = uVar111;
          auVar77._16_8_ = uVar133;
          auVar77._24_8_ = uVar142;
          auVar76._8_8_ = uVar125;
          auVar76._0_8_ = uVar112;
          auVar76._16_8_ = uVar134;
          auVar76._24_8_ = uVar143;
          auVar117 = vpackuswb_avx2(auVar77,auVar76);
          auVar75._8_8_ = uVar126;
          auVar75._0_8_ = uVar113;
          auVar75._16_8_ = uVar135;
          auVar75._24_8_ = uVar144;
          auVar74._8_8_ = uVar127;
          auVar74._0_8_ = uVar114;
          auVar74._16_8_ = uVar136;
          auVar74._24_8_ = uVar145;
          auVar118 = vpackuswb_avx2(auVar75,auVar74);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_ba8 = local_3040;
          local_3300 = auVar117._0_8_;
          local_1100 = local_3300;
          uStack_32f8 = auVar117._8_8_;
          uStack_10f8 = uStack_32f8;
          uStack_32f0 = auVar117._16_8_;
          uStack_10f0 = uStack_32f0;
          puStack_32e8 = auVar117._24_8_;
          puStack_10e8 = puStack_32e8;
          local_bc0 = local_3300;
          uStack_bb8 = uStack_32f8;
          *local_3040 = local_3300;
          local_3040[1] = uStack_32f8;
          local_bc8 = puStack_32e8;
          uStack_bd0 = uStack_32f0;
          *puStack_32e8 = local_be0;
          puStack_32e8[1] = uStack_bd8;
          local_be8 = local_3040 + 2;
          local_3320 = auVar118._0_8_;
          local_1120 = local_3320;
          uStack_3318 = auVar118._8_8_;
          uStack_1118 = uStack_3318;
          uStack_3310 = auVar118._16_8_;
          uStack_1110 = uStack_3310;
          uStack_3308 = auVar118._24_8_;
          uStack_1108 = uStack_3308;
          local_c00 = local_3320;
          uStack_bf8 = uStack_3318;
          *local_be8 = local_3320;
          local_3040[3] = uStack_3318;
          local_c08 = (undefined8 *)((long)local_3044 + 0x10 + (long)local_3040);
          local_c20 = uStack_3310;
          uStack_c18 = uStack_3308;
          *local_c08 = uStack_3310;
          local_c08[1] = uStack_3308;
          local_3144 = local_3144 + -2;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 1));
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 1) * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 1));
          local_1520 = uVar114;
          uStack_1518 = uVar127;
          uStack_1510 = uVar136;
          uStack_1508 = uVar145;
          local_1500 = uVar113;
          uStack_14f8 = uVar126;
          uStack_14f0 = uVar135;
          uStack_14e8 = uVar144;
          local_14e0 = uVar112;
          uStack_14d8 = uVar125;
          uStack_14d0 = uVar134;
          uStack_14c8 = uVar143;
          local_14c0 = uVar111;
          uStack_14b8 = uVar124;
          uStack_14b0 = uVar133;
          uStack_14a8 = uVar142;
        } while (local_3144 != 0);
      }
      else {
        do {
          local_908 = local_3030;
          local_450 = *(undefined8 *)*local_3030;
          uStack_448 = *(undefined8 *)(*local_3030 + 8);
          auVar117 = vpmovzxbw_avx2(*local_3030);
          local_910 = (undefined1 (*) [16])(*local_3030 + (int)local_3034);
          local_460 = *(undefined8 *)*local_910;
          uStack_458 = *(undefined8 *)(*local_910 + 8);
          auVar118 = vpmovzxbw_avx2(*local_910);
          local_918 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 * 2));
          local_470 = *(undefined8 *)*local_918;
          uStack_468 = *(undefined8 *)(*local_918 + 8);
          auVar1 = vpmovzxbw_avx2(*local_918);
          local_920 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 * 3));
          local_480 = *(undefined8 *)*local_920;
          uStack_478 = *(undefined8 *)(*local_920 + 8);
          auVar2 = vpmovzxbw_avx2(*local_920);
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_1d40 = local_3180;
          uStack_1d38 = uStack_3178;
          uStack_1d30 = uStack_3170;
          uStack_1d28 = uStack_3168;
          local_1d44 = 4;
          auVar117 = vpsllw_avx2(auVar117,ZEXT416(4));
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_1d80 = local_31a0;
          uStack_1d78 = uStack_3198;
          uStack_1d70 = uStack_3190;
          uStack_1d68 = uStack_3188;
          local_1d84 = 4;
          auVar118 = vpsllw_avx2(auVar118,ZEXT416(4));
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_1dc0 = local_31c0;
          uStack_1db8 = uStack_31b8;
          uStack_1db0 = uStack_31b0;
          uStack_1da8 = uStack_31a8;
          local_1dc4 = 4;
          auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_1e00 = local_31e0;
          uStack_1df8 = uStack_31d8;
          uStack_1df0 = uStack_31d0;
          uStack_1de8 = uStack_31c8;
          local_1e04 = 4;
          auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
          local_3180 = auVar117._0_8_;
          uStack_3178 = auVar117._8_8_;
          uStack_3170 = auVar117._16_8_;
          uStack_3168 = auVar117._24_8_;
          local_28c0 = local_3180;
          uStack_28b8 = uStack_3178;
          uStack_28b0 = uStack_3170;
          uStack_28a8 = uStack_3168;
          local_28e0 = local_3100;
          lStack_28d8 = lStack_30f8;
          lStack_28d0 = lStack_30f0;
          lStack_28c8 = lStack_30e8;
          auVar31._8_8_ = lStack_30f8;
          auVar31._0_8_ = local_3100;
          auVar31._16_8_ = lStack_30f0;
          auVar31._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar117,auVar31);
          local_31a0 = auVar118._0_8_;
          uStack_3198 = auVar118._8_8_;
          uStack_3190 = auVar118._16_8_;
          uStack_3188 = auVar118._24_8_;
          local_2900 = local_31a0;
          uStack_28f8 = uStack_3198;
          uStack_28f0 = uStack_3190;
          uStack_28e8 = uStack_3188;
          local_2920 = local_3100;
          lStack_2918 = lStack_30f8;
          lStack_2910 = lStack_30f0;
          lStack_2908 = lStack_30e8;
          auVar30._8_8_ = lStack_30f8;
          auVar30._0_8_ = local_3100;
          auVar30._16_8_ = lStack_30f0;
          auVar30._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar118,auVar30);
          local_31c0 = auVar1._0_8_;
          uStack_31b8 = auVar1._8_8_;
          uStack_31b0 = auVar1._16_8_;
          uStack_31a8 = auVar1._24_8_;
          local_2940 = local_31c0;
          uStack_2938 = uStack_31b8;
          uStack_2930 = uStack_31b0;
          uStack_2928 = uStack_31a8;
          local_2960 = local_3100;
          lStack_2958 = lStack_30f8;
          lStack_2950 = lStack_30f0;
          lStack_2948 = lStack_30e8;
          auVar29._8_8_ = lStack_30f8;
          auVar29._0_8_ = local_3100;
          auVar29._16_8_ = lStack_30f0;
          auVar29._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar1,auVar29);
          local_31e0 = auVar2._0_8_;
          uStack_31d8 = auVar2._8_8_;
          uStack_31d0 = auVar2._16_8_;
          uStack_31c8 = auVar2._24_8_;
          local_2980 = local_31e0;
          uStack_2978 = uStack_31d8;
          uStack_2970 = uStack_31d0;
          uStack_2968 = uStack_31c8;
          local_29a0 = local_3100;
          lStack_2998 = lStack_30f8;
          lStack_2990 = lStack_30f0;
          lStack_2988 = lStack_30e8;
          auVar28._8_8_ = lStack_30f8;
          auVar28._0_8_ = local_3100;
          auVar28._16_8_ = lStack_30f0;
          auVar28._24_8_ = lStack_30e8;
          vpaddw_avx2(auVar2,auVar28);
          local_648 = local_3058;
          local_650 = (long)*local_3058 + (long)(int)local_305c * 2;
          local_658 = (long)*local_3058 + (long)(int)(local_305c * 2) * 2;
          local_660 = (undefined8 *)((long)*local_3058 + (long)(int)(local_305c * 3) * 2);
          uVar111 = *local_660;
          uVar124 = local_660[1];
          uVar133 = local_660[2];
          uVar142 = local_660[3];
          palVar104 = (__m256i *)local_30a0;
          comp_avg(palVar104,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(palVar104,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(palVar104,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          comp_avg(palVar104,in_stack_ffffffffffffc688,in_stack_ffffffffffffc680,
                   in_stack_ffffffffffffc67c);
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar112 = uVar111;
          uVar125 = uVar124;
          uVar134 = uVar133;
          uVar143 = uVar142;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar113 = uVar112;
          uVar126 = uVar125;
          uVar135 = uVar134;
          uVar144 = uVar143;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          uVar114 = uVar113;
          uVar127 = uVar126;
          uVar136 = uVar135;
          uVar145 = uVar144;
          convolve_rounding(in_stack_ffffffffffffc5d0,
                            (__m256i *)CONCAT44(in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8)
                            ,in_stack_ffffffffffffc5c0,iVar152);
          auVar73._8_8_ = uVar124;
          auVar73._0_8_ = uVar111;
          auVar73._16_8_ = uVar133;
          auVar73._24_8_ = uVar142;
          auVar72._8_8_ = uVar125;
          auVar72._0_8_ = uVar112;
          auVar72._16_8_ = uVar134;
          auVar72._24_8_ = uVar143;
          auVar117 = vpackuswb_avx2(auVar73,auVar72);
          auVar71._8_8_ = uVar126;
          auVar71._0_8_ = uVar113;
          auVar71._16_8_ = uVar135;
          auVar71._24_8_ = uVar144;
          auVar70._8_8_ = uVar127;
          auVar70._0_8_ = uVar114;
          auVar70._16_8_ = uVar136;
          auVar70._24_8_ = uVar145;
          auVar118 = vpackuswb_avx2(auVar71,auVar70);
          auVar117 = vpermq_avx2(auVar117,0xd8);
          auVar118 = vpermq_avx2(auVar118,0xd8);
          local_c28 = local_3040;
          local_3300 = auVar117._0_8_;
          local_1140 = local_3300;
          uStack_32f8 = auVar117._8_8_;
          uStack_1138 = uStack_32f8;
          uStack_32f0 = auVar117._16_8_;
          uStack_1130 = uStack_32f0;
          puStack_32e8 = auVar117._24_8_;
          puStack_1128 = puStack_32e8;
          local_c40 = local_3300;
          uStack_c38 = uStack_32f8;
          *local_3040 = local_3300;
          local_3040[1] = uStack_32f8;
          local_c48 = puStack_32e8;
          uStack_c50 = uStack_32f0;
          *puStack_32e8 = local_c60;
          puStack_32e8[1] = uStack_c58;
          local_c68 = (undefined8 *)((long)local_3040 + (long)(local_3044 * 2));
          local_3320 = auVar118._0_8_;
          local_1160 = local_3320;
          uStack_3318 = auVar118._8_8_;
          uStack_1158 = uStack_3318;
          uStack_3310 = auVar118._16_8_;
          uStack_1150 = uStack_3310;
          uStack_3308 = auVar118._24_8_;
          uStack_1148 = uStack_3308;
          local_c80 = local_3320;
          uStack_c78 = uStack_3318;
          *local_c68 = local_3320;
          local_c68[1] = uStack_3318;
          local_c88 = (undefined8 *)((long)local_3040 + (long)(local_3044 * 3));
          local_ca0 = uStack_3310;
          uStack_c98 = uStack_3308;
          *local_c88 = uStack_3310;
          local_c88[1] = uStack_3308;
          local_3144 = local_3144 + -4;
          local_3030 = (undefined1 (*) [16])(*local_3030 + (int)(local_3034 << 2));
          local_3058 = (__m256i *)((long)*local_3058 + (long)(int)(local_305c << 2) * 2);
          local_3040 = (undefined8 *)((long)local_3040 + (long)(local_3044 << 2));
          local_15a0 = uVar114;
          uStack_1598 = uVar127;
          uStack_1590 = uVar136;
          uStack_1588 = uVar145;
          local_1580 = uVar113;
          uStack_1578 = uVar126;
          uStack_1570 = uVar135;
          uStack_1568 = uVar144;
          local_1560 = uVar112;
          uStack_1558 = uVar125;
          uStack_1550 = uVar134;
          uStack_1548 = uVar143;
          local_1540 = uVar111;
          uStack_1538 = uVar124;
          uStack_1530 = uVar133;
          uStack_1528 = uVar142;
        } while (local_3144 != 0);
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_copy_avx2(const uint8_t *src, int src_stride,
                                        uint8_t *dst0, int dst_stride0, int w,
                                        int h, ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  assert(conv_params->round_0 == 3);
  assert(conv_params->round_1 == 7);
  assert(w % 4 == 0);
  assert(h % 4 == 0);

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const __m256i zero = _mm256_setzero_si256();

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  if (do_average) {
    if (use_dist_wtd_comp_avg) {
      DO_AVG_2D_COPY(1)
    } else {
      DO_AVG_2D_COPY(0)
    }
  } else {
    av1_dist_wtd_convolve_2d_no_avg_copy_avx2(src, src_stride, dst, dst_stride,
                                              w, h, offset_const);
  }
}